

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86_fma::forward_int8_x86
          (Convolution_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  short sVar1;
  short sVar2;
  _func_int *p_Var3;
  Layer *pLVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  undefined1 uVar8;
  undefined1 uVar10;
  undefined1 uVar12;
  undefined4 uVar13;
  undefined1 uVar14;
  undefined1 uVar16;
  undefined1 uVar18;
  undefined1 uVar20;
  undefined1 uVar21;
  undefined1 uVar22;
  undefined1 uVar24;
  undefined1 uVar26;
  undefined4 uVar27;
  undefined1 uVar28;
  undefined1 uVar30;
  undefined1 uVar32;
  undefined1 uVar34;
  undefined1 uVar35;
  undefined1 uVar36;
  undefined1 uVar38;
  undefined1 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  int n_2;
  ulong uVar44;
  undefined1 (*pauVar45) [16];
  short asVar46 [4];
  uint uVar47;
  uint uVar48;
  undefined1 (*pauVar49) [16];
  short asVar50 [4];
  long lVar51;
  ulong uVar52;
  undefined1 *puVar53;
  ulong uVar54;
  undefined1 (*pauVar55) [16];
  void *pvVar56;
  undefined1 (*pauVar57) [16];
  short asVar58 [4];
  int j_2;
  int n;
  size_t sVar59;
  size_t sVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  ulong uVar64;
  void *pvVar65;
  long lVar66;
  int *piVar67;
  int iVar68;
  long lVar69;
  short asVar70 [4];
  short asVar71 [4];
  long lVar72;
  int j_1;
  uint uVar73;
  uint uVar74;
  undefined8 *puVar75;
  undefined8 *puVar76;
  short asVar77 [4];
  int *piVar78;
  int u_1;
  undefined1 *puVar79;
  ulong uVar80;
  ulong uVar81;
  int i;
  int iVar82;
  long lVar83;
  ulong uVar84;
  void *pvVar85;
  long lVar86;
  int v_1;
  uint uVar87;
  int iVar88;
  undefined1 *puVar89;
  ulong uVar90;
  void *pvVar91;
  long lVar92;
  int r;
  int iVar93;
  void *pvVar94;
  size_t sVar95;
  size_t sVar96;
  int u_4;
  int iVar97;
  uint uVar98;
  undefined1 (*pauVar99) [16];
  void *pvVar100;
  long lVar101;
  int i_2;
  int iVar102;
  ulong uVar103;
  int u;
  uint uVar104;
  int iVar105;
  ulong uVar106;
  void *pvVar107;
  short asVar108 [4];
  long lVar109;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar121 [16];
  undefined1 auVar124 [64];
  undefined1 extraout_var [56];
  undefined1 auVar125 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar126 [16];
  undefined1 auVar127 [64];
  undefined1 auVar128 [16];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [16];
  undefined1 auVar134 [64];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  Mat *local_700;
  void *local_6e8;
  void *local_6e0;
  Mat *local_6b8;
  undefined8 uStack_6b0;
  int *local_6a0;
  Mat local_688;
  short local_640 [4];
  short local_638 [4];
  short local_630 [4];
  void *local_628;
  short local_620 [4];
  Mat local_618;
  int *local_5d0;
  void *local_5c8;
  ulong local_5c0;
  short d0 [4];
  Mat local_568;
  short local_518 [4];
  ulong local_510;
  short t3 [4];
  short t2 [4];
  short t1 [4];
  short t0 [4];
  void *local_4e8;
  short d1 [4];
  Option opt_b;
  size_t local_448;
  void *local_438;
  short w3 [4];
  short local_420 [2];
  short local_41c [2];
  short w2 [4];
  short local_410 [2];
  short local_40c [2];
  short local_408 [4];
  ulong local_400;
  short local_3f8 [4];
  Mat *local_3f0;
  undefined1 auStack_3e8 [4];
  int local_3e4;
  int local_3e0;
  int local_3dc;
  short w1 [4];
  int aiStack_3d0 [2];
  Option opt_q;
  int aiStack_380 [2];
  undefined1 local_378 [16];
  undefined1 auStack_368 [80];
  undefined1 local_318 [16];
  undefined1 auStack_308 [80];
  undefined1 local_2b8 [16];
  undefined1 auStack_2a8 [80];
  undefined1 local_258 [16];
  undefined1 auStack_248 [96];
  undefined1 auStack_1e8 [96];
  undefined8 local_188;
  long local_180;
  long local_178;
  size_t local_170;
  undefined8 local_168;
  short local_160 [4];
  ulong local_158;
  int o0 [2];
  Mat local_148;
  short w0 [4];
  short d3 [4];
  short d2 [4];
  undefined4 uVar7;
  undefined3 uVar9;
  undefined2 uVar11;
  undefined4 uVar15;
  undefined3 uVar17;
  undefined2 uVar19;
  undefined3 uVar23;
  undefined2 uVar25;
  undefined4 uVar29;
  undefined3 uVar31;
  undefined2 uVar33;
  undefined3 uVar37;
  undefined2 uVar39;
  
  local_148.elempack = bottom_blob->elempack;
  local_148.elemsize = bottom_blob->elemsize;
  piVar78 = bottom_blob->refcount;
  local_148.data = bottom_blob->data;
  local_148.refcount = bottom_blob->refcount;
  local_148.allocator = bottom_blob->allocator;
  local_148.dims = bottom_blob->dims;
  local_148.w = bottom_blob->w;
  local_148.h = bottom_blob->h;
  local_148.d = bottom_blob->d;
  local_148.c = bottom_blob->c;
  local_148.cstep = bottom_blob->cstep;
  if (piVar78 != (int *)0x0) {
    LOCK();
    *piVar78 = *piVar78 + 1;
    UNLOCK();
  }
  if (local_148.elempack == 0 || ((int)local_148.elemsize * 8) / local_148.elempack != 8) {
    opt_q.lightmode = opt->lightmode;
    opt_q._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_q.num_threads = opt->num_threads;
    uVar5 = opt->openmp_blocktime;
    uVar6 = opt->use_winograd_convolution;
    uVar8 = opt->use_sgemm_convolution;
    uVar10 = opt->use_int8_inference;
    uVar12 = opt->use_vulkan_compute;
    uVar11 = CONCAT11(uVar12,uVar10);
    uVar9 = CONCAT21(uVar11,uVar8);
    uVar7 = CONCAT31(uVar9,uVar6);
    opt_q.use_bf16_storage = opt->use_bf16_storage;
    opt_q.use_fp16_packed = opt->use_fp16_packed;
    opt_q.use_fp16_storage = opt->use_fp16_storage;
    opt_q.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_q.use_int8_packed = opt->use_int8_packed;
    opt_q.use_int8_storage = opt->use_int8_storage;
    opt_q.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_q.use_packing_layout = opt->use_packing_layout;
    opt_q.use_shader_pack8 = opt->use_shader_pack8;
    opt_q.use_subgroup_basic = opt->use_subgroup_basic;
    opt_q.use_subgroup_vote = opt->use_subgroup_vote;
    opt_q.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_q.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_q.use_image_storage = opt->use_image_storage;
    opt_q.use_tensor_storage = opt->use_tensor_storage;
    opt_q.use_reserved_0 = opt->use_reserved_0;
    opt_q.flush_denormals = opt->flush_denormals;
    opt_q.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_q.use_shader_local_memory = opt->use_shader_local_memory;
    opt_q.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_q.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_q.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_q.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_q.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    opt_q.use_reserved_7 = opt->use_reserved_7;
    opt_q.use_reserved_8 = opt->use_reserved_8;
    opt_q.use_reserved_9 = opt->use_reserved_9;
    opt_q.use_reserved_10 = opt->use_reserved_10;
    opt_q.use_reserved_11 = opt->use_reserved_11;
    opt_q.workspace_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_q.workspace_allocator._4_4_ = (int)((ulong)opt->workspace_allocator >> 0x20);
    opt_q.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_q.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    opt_q.openmp_blocktime = uVar5;
    opt_q._28_4_ = uVar7;
    quantize_to_int8(bottom_blob,&local_148,
                     (Mat *)(&this->field_0x238 + (long)this->_vptr_Convolution_x86_fma[-3]),&opt_q)
    ;
  }
  local_688.cstep = 0;
  local_688.data = (void *)0x0;
  local_688.refcount._0_4_ = 0;
  local_688.refcount._4_4_ = 0;
  local_688.elemsize = 0;
  local_688.elempack = 0;
  local_688.allocator = (Allocator *)0x0;
  local_688.dims = 0;
  local_688.w = 0;
  local_688.h = 0;
  local_688.d = 0;
  local_688.c = 0;
  Convolution::make_padding
            ((Convolution *)
             ((long)&this->_vptr_Convolution_x86_fma + (long)this->_vptr_Convolution_x86_fma[-3]),
             &local_148,&local_688,opt);
  iVar63 = local_688.elempack;
  iVar82 = -100;
  if ((local_688.data == (void *)0x0) || (local_688.cstep * (long)local_688.c == 0))
  goto LAB_001fadbb;
  p_Var3 = this->_vptr_Convolution_x86_fma[-3];
  uVar74 = *(uint *)(p_Var3 + 0x28 + (long)&(this->weight_winograd23_data).data);
  iVar97 = (~((*(int *)(p_Var3 + 0x2c + (long)&(this->weight_winograd23_data).data) + -1) *
             *(int *)(p_Var3 + 0x34 + (long)&(this->weight_winograd23_data).data)) + local_688.w) /
           *(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) + 1;
  iVar93 = (~((*(int *)(p_Var3 + 0x30 + (long)&(this->weight_winograd23_data).data) + -1) *
             *(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data)) + local_688.h) /
           *(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) + 1;
  iVar88 = *(int *)(p_Var3 + 0x18 + (long)&(this->weight_winograd43_data).data);
  if (opt->use_packing_layout == true) {
    if (iVar88 < 0x65) {
      uVar73 = (uint)((uVar74 & 3) == 0) * 3 + 1;
    }
    else {
      uVar73 = 1;
      if ((uVar74 & 7) == 0) {
        uVar73 = 8;
      }
    }
  }
  else {
    uVar73 = 1;
  }
  uVar87 = uVar73 * 4;
  if (100 < iVar88) {
    uVar87 = uVar73;
  }
  local_620 = (short  [4])(long)local_688.c;
  Mat::create(top_blob,iVar97,iVar93,(int)uVar74 / (int)uVar73,(ulong)uVar87,uVar73,
              opt->blob_allocator);
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_001fadbb;
  if (opt->use_packing_layout == true) {
    local_638._0_4_ =
         (uint)(((byte)(this->_vptr_Convolution_x86_fma[-3] + 0x28)
                       [(long)&(this->weight_winograd23_data).data] & 3) == 0) * 3 + 1;
    local_638[2] = 0;
    local_638[3] = 0;
  }
  else {
    local_638[0] = 1;
    local_638[1] = 0;
    local_638[2] = 0;
    local_638[3] = 0;
  }
  local_618.cstep = 0;
  local_618.data = (void *)0x0;
  local_618.refcount._0_4_ = 0;
  local_618.refcount._4_4_ = 0;
  local_618.elemsize = 0;
  local_618.elempack = 0;
  local_618.allocator = (Allocator *)0x0;
  local_618.dims = 0;
  local_618.w = 0;
  local_618.h = 0;
  local_618.d = 0;
  local_618.c = 0;
  iVar82 = local_638._0_4_;
  local_3f0 = top_blob;
  local_3dc = iVar88;
  Mat::create(&local_618,iVar97,iVar93,
              *(int *)(this->_vptr_Convolution_x86_fma[-3] + 0x28 +
                      (long)&(this->weight_winograd23_data).data) / iVar82,(ulong)(uint)(iVar82 * 4)
              ,iVar82,opt->workspace_allocator);
  iVar93 = local_618.c;
  uVar87 = local_618.h;
  uVar73 = local_618.w;
  uVar74 = local_688.c;
  iVar88 = local_688.w;
  iVar82 = -100;
  if (((short  [4])local_618.data != (short  [4])0x0) && (local_618.cstep * (long)local_618.c != 0))
  {
    if ((iVar63 != 8) || (local_638._0_4_ != 4)) goto LAB_001f8aad;
    p_Var3 = this->_vptr_Convolution_x86_fma[-3];
    uVar98 = *(uint *)(p_Var3 + 0x2c + (long)&(this->weight_winograd23_data).data);
    uVar44 = (ulong)uVar98;
    if ((uVar98 == 1) && (*(int *)(p_Var3 + 0x30 + (long)&(this->weight_winograd23_data).data) == 1)
       ) {
      if ((*(int *)(p_Var3 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1) &&
         (((*(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
          (*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)))) {
        conv1x1s1_sgemm_pack8to4_int8_sse(&local_688,&local_618,&this->weight_sgemm_data,opt);
        goto LAB_001facda;
      }
      if (((*(int *)(p_Var3 + 0x34 + (long)&(this->weight_winograd23_data).data) != 1) ||
          (*(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data) != 1)) ||
         ((*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) != 2 ||
          (*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) != 2))))
      goto LAB_001f84b0;
      opt_q.lightmode = false;
      opt_q._1_3_ = 0;
      opt_q.num_threads = 0;
      opt_q.blob_allocator._0_4_ = 0;
      opt_q.blob_allocator._4_4_ = 0;
      opt_q.workspace_allocator._0_4_ = 0;
      opt_q.workspace_allocator._4_4_ = 0;
      opt_q.openmp_blocktime = 0;
      opt_q._32_28_ = ZEXT1228((undefined1  [12])0x0);
      Mat::create((Mat *)&opt_q,local_618.w,local_618.h,local_688.c,local_688.elemsize,
                  local_688.elempack,opt->workspace_allocator);
      uVar64 = 0;
      uVar44 = (ulong)uVar73;
      if ((int)uVar73 < 1) {
        uVar44 = uVar64;
      }
      uVar103 = (ulong)uVar87;
      if ((int)uVar87 < 1) {
        uVar103 = uVar64;
      }
      uVar106 = (ulong)uVar74;
      if ((int)uVar74 < 1) {
        uVar106 = uVar64;
      }
      for (; uVar64 != uVar106; uVar64 = uVar64 + 1) {
        puVar75 = (undefined8 *)
                  (local_688.cstep * uVar64 * local_688.elemsize + (long)local_688.data);
        puVar76 = (undefined8 *)opt_q._0_8_;
        for (iVar82 = 0; uVar81 = uVar44, iVar82 != (int)uVar103; iVar82 = iVar82 + 1) {
          while (iVar93 = (int)uVar81, uVar81 = (ulong)(iVar93 - 1), iVar93 != 0) {
            *puVar76 = *puVar75;
            puVar75 = puVar75 + 2;
            puVar76 = puVar76 + 1;
          }
          puVar75 = puVar75 + (int)((iVar88 - uVar73) * 2);
        }
      }
      conv1x1s1_sgemm_pack8to4_int8_sse((Mat *)&opt_q,&local_618,&this->weight_sgemm_data,opt);
      piVar78 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
      if (piVar78 != (int *)0x0) {
        LOCK();
        *piVar78 = *piVar78 + -1;
        UNLOCK();
        if (*piVar78 == 0) {
          if (opt_q._32_8_ == 0) {
LAB_001fae98:
            free((void *)opt_q._0_8_);
          }
          else {
            (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
          }
        }
      }
LAB_001f8aad:
      iVar97 = local_618.c;
      uVar74 = local_618.h;
      iVar93 = local_618.w;
      iVar88 = local_688.c;
      iVar82 = local_688.w;
      if ((iVar63 == 1) && (local_638._0_4_ == 4)) {
        p_Var3 = this->_vptr_Convolution_x86_fma[-3];
        uVar73 = *(uint *)(p_Var3 + 0x2c + (long)&(this->weight_winograd23_data).data);
        uVar44 = (ulong)uVar73;
        if (uVar73 == 7) {
          if ((((*(int *)(p_Var3 + 0x30 + (long)&(this->weight_winograd23_data).data) != 7) ||
               (*(int *)(p_Var3 + 0x34 + (long)&(this->weight_winograd23_data).data) != 1)) ||
              (*(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data) != 1)) ||
             ((*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) != 2 ||
              (*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) != 2))))
          goto LAB_001f9339;
          opt_q.lightmode = false;
          opt_q._1_3_ = 0;
          opt_q.num_threads = 0;
          opt_q.blob_allocator._0_4_ = 0;
          opt_q.blob_allocator._4_4_ = 0;
          opt_q.workspace_allocator._0_4_ = 0;
          opt_q.workspace_allocator._4_4_ = 0;
          opt_q.openmp_blocktime = 0;
          opt_q._32_28_ = ZEXT1228((undefined1  [12])0x0);
          Mat::create((Mat *)&opt_q,local_618.h * local_618.w,0x31,local_688.c,1,1,
                      opt->workspace_allocator);
          uVar64 = 0;
          uVar44 = (ulong)uVar74;
          if ((int)uVar74 < 1) {
            uVar44 = uVar64;
          }
          uVar103 = (ulong)(uint)iVar88;
          if (iVar88 < 1) {
            uVar103 = uVar64;
          }
          for (; uVar64 != uVar103; uVar64 = uVar64 + 1) {
            lVar69 = opt_q._0_8_;
            for (lVar83 = 0; lVar83 != 7; lVar83 = lVar83 + 1) {
              for (lVar51 = 0; lVar51 != 7; lVar51 = lVar51 + 1) {
                puVar53 = (undefined1 *)
                          ((long)local_688.data +
                          lVar51 + (long)local_688.w * local_688.elemsize * lVar83 +
                                   local_688.cstep * uVar64 * local_688.elemsize);
                for (iVar88 = 0; iVar88 != (int)uVar44; iVar88 = iVar88 + 1) {
                  puVar79 = puVar53 + (iVar82 - iVar93) * 2;
                  puVar89 = puVar53;
                  for (lVar92 = 0; (int)lVar92 + 3 < iVar93; lVar92 = lVar92 + 4) {
                    *(undefined1 *)(lVar69 + lVar92) = *puVar89;
                    *(undefined1 *)(lVar69 + 1 + lVar92) = puVar89[2];
                    *(undefined1 *)(lVar69 + 2 + lVar92) = puVar89[4];
                    *(undefined1 *)(lVar69 + 3 + lVar92) = puVar89[6];
                    puVar89 = puVar89 + 8;
                    puVar79 = puVar79 + 8;
                  }
                  for (; (int)lVar92 + 1 < iVar93; lVar92 = lVar92 + 2) {
                    *(undefined1 *)(lVar69 + lVar92) = *puVar89;
                    *(undefined1 *)(lVar69 + 1 + lVar92) = puVar89[2];
                    puVar89 = puVar89 + 4;
                    puVar79 = puVar79 + 4;
                  }
                  for (; (int)lVar92 < iVar93; lVar92 = lVar92 + 1) {
                    *(undefined1 *)(lVar69 + lVar92) = puVar53[lVar92 * 2];
                    puVar79 = puVar79 + 2;
                  }
                  lVar69 = lVar69 + lVar92;
                  puVar53 = puVar79;
                }
              }
            }
          }
          im2col_sgemm_pack1to4_int8_sse((Mat *)&opt_q,&local_618,&this->weight_sgemm_data,opt);
          piVar78 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
          if (piVar78 != (int *)0x0) {
            LOCK();
            *piVar78 = *piVar78 + -1;
            UNLOCK();
            if (*piVar78 == 0) {
              if (opt_q._32_8_ == 0) goto LAB_001fb075;
              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            }
          }
        }
        else if (uVar73 == 3) {
          if (*(int *)(p_Var3 + 0x30 + (long)&(this->weight_winograd23_data).data) != 3)
          goto LAB_001f9339;
          if (((*(int *)(p_Var3 + 0x34 + (long)&(this->weight_winograd23_data).data) != 1) ||
              (*(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data) != 1)) ||
             ((*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1 ||
              (*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)))) {
            if ((((*(int *)(p_Var3 + 0x34 + (long)&(this->weight_winograd23_data).data) != 1) ||
                 (*(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data) != 1)) ||
                (*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) != 2)) ||
               (*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) != 2))
            goto LAB_001f9339;
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator._0_4_ = 0;
            opt_q.blob_allocator._4_4_ = 0;
            opt_q.workspace_allocator._0_4_ = 0;
            opt_q.workspace_allocator._4_4_ = 0;
            opt_q.openmp_blocktime = 0;
            opt_q._32_28_ = ZEXT1228((undefined1  [12])0x0);
            Mat::create((Mat *)&opt_q,local_618.h * local_618.w,9,local_688.c,1,1,
                        opt->workspace_allocator);
            uVar64 = 0;
            uVar44 = (ulong)uVar74;
            if ((int)uVar74 < 1) {
              uVar44 = uVar64;
            }
            uVar103 = (ulong)(uint)iVar88;
            if (iVar88 < 1) {
              uVar103 = uVar64;
            }
            for (; uVar64 != uVar103; uVar64 = uVar64 + 1) {
              lVar69 = opt_q._0_8_;
              for (lVar83 = 0; lVar83 != 3; lVar83 = lVar83 + 1) {
                for (lVar51 = 0; lVar51 != 3; lVar51 = lVar51 + 1) {
                  puVar53 = (undefined1 *)
                            ((long)local_688.data +
                            lVar51 + (long)local_688.w * local_688.elemsize * lVar83 +
                                     local_688.cstep * uVar64 * local_688.elemsize);
                  for (iVar88 = 0; iVar88 != (int)uVar44; iVar88 = iVar88 + 1) {
                    puVar79 = puVar53 + (iVar82 - iVar93) * 2;
                    puVar89 = puVar53;
                    for (lVar92 = 0; (int)lVar92 + 3 < iVar93; lVar92 = lVar92 + 4) {
                      *(undefined1 *)(lVar69 + lVar92) = *puVar89;
                      *(undefined1 *)(lVar69 + 1 + lVar92) = puVar89[2];
                      *(undefined1 *)(lVar69 + 2 + lVar92) = puVar89[4];
                      *(undefined1 *)(lVar69 + 3 + lVar92) = puVar89[6];
                      puVar89 = puVar89 + 8;
                      puVar79 = puVar79 + 8;
                    }
                    for (; (int)lVar92 + 1 < iVar93; lVar92 = lVar92 + 2) {
                      *(undefined1 *)(lVar69 + lVar92) = *puVar89;
                      *(undefined1 *)(lVar69 + 1 + lVar92) = puVar89[2];
                      puVar89 = puVar89 + 4;
                      puVar79 = puVar79 + 4;
                    }
                    for (; (int)lVar92 < iVar93; lVar92 = lVar92 + 1) {
                      *(undefined1 *)(lVar69 + lVar92) = puVar53[lVar92 * 2];
                      puVar79 = puVar79 + 2;
                    }
                    lVar69 = lVar69 + lVar92;
                    puVar53 = puVar79;
                  }
                }
              }
            }
            im2col_sgemm_pack1to4_int8_sse((Mat *)&opt_q,&local_618,&this->weight_sgemm_data,opt);
            piVar78 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
            if (piVar78 != (int *)0x0) {
              LOCK();
              *piVar78 = *piVar78 + -1;
              UNLOCK();
              if (*piVar78 == 0) {
                if (opt_q._32_8_ == 0) goto LAB_001fb075;
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
            goto LAB_001f986c;
          }
          opt_q.lightmode = false;
          opt_q._1_3_ = 0;
          opt_q.num_threads = 0;
          opt_q.blob_allocator._0_4_ = 0;
          opt_q.blob_allocator._4_4_ = 0;
          opt_q.workspace_allocator._0_4_ = 0;
          opt_q.workspace_allocator._4_4_ = 0;
          opt_q.openmp_blocktime = 0;
          opt_q._32_28_ = ZEXT1228((undefined1  [12])0x0);
          Mat::create((Mat *)&opt_q,local_618.h * local_618.w,9,local_688.c,1,1,
                      opt->workspace_allocator);
          uVar64 = 0;
          uVar44 = (ulong)uVar74;
          if ((int)uVar74 < 1) {
            uVar44 = uVar64;
          }
          uVar103 = (ulong)(uint)iVar88;
          if (iVar88 < 1) {
            uVar103 = uVar64;
          }
          for (; uVar64 != uVar103; uVar64 = uVar64 + 1) {
            lVar69 = opt_q._0_8_;
            for (lVar83 = 0; lVar83 != 3; lVar83 = lVar83 + 1) {
              for (lVar51 = 0; lVar51 != 3; lVar51 = lVar51 + 1) {
                lVar92 = (long)local_688.data +
                         lVar51 + (long)local_688.w * local_688.elemsize * lVar83 +
                                  local_688.cstep * uVar64 * local_688.elemsize;
                for (iVar88 = 0; iVar88 != (int)uVar44; iVar88 = iVar88 + 1) {
                  for (lVar86 = 0; (int)lVar86 + 3 < iVar93; lVar86 = lVar86 + 4) {
                    *(undefined1 *)(lVar69 + lVar86) = *(undefined1 *)(lVar92 + lVar86);
                    *(undefined1 *)(lVar69 + 1 + lVar86) = *(undefined1 *)(lVar92 + 1 + lVar86);
                    *(undefined1 *)(lVar69 + 2 + lVar86) = *(undefined1 *)(lVar92 + 2 + lVar86);
                    *(undefined1 *)(lVar69 + 3 + lVar86) = *(undefined1 *)(lVar92 + 3 + lVar86);
                  }
                  for (; (int)lVar86 + 1 < iVar93; lVar86 = lVar86 + 2) {
                    *(undefined1 *)(lVar69 + lVar86) = *(undefined1 *)(lVar92 + lVar86);
                    *(undefined1 *)(lVar69 + 1 + lVar86) = *(undefined1 *)(lVar92 + 1 + lVar86);
                  }
                  for (; (int)lVar86 < iVar93; lVar86 = lVar86 + 1) {
                    *(undefined1 *)(lVar69 + lVar86) = *(undefined1 *)(lVar92 + lVar86);
                  }
                  lVar92 = lVar92 + (iVar82 - iVar93) + lVar86;
                  lVar69 = lVar69 + lVar86;
                }
              }
            }
          }
          im2col_sgemm_pack1to4_int8_sse((Mat *)&opt_q,&local_618,&this->weight_sgemm_data,opt);
          piVar78 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
          if (piVar78 == (int *)0x0) goto LAB_001f986c;
          LOCK();
          *piVar78 = *piVar78 + -1;
          UNLOCK();
          if (*piVar78 != 0) goto LAB_001f986c;
          if (opt_q._32_8_ != 0) {
            (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            goto LAB_001f986c;
          }
LAB_001fb075:
          free((void *)opt_q._0_8_);
        }
        else {
          if ((uVar73 == 1) &&
             (*(int *)(p_Var3 + 0x30 + (long)&(this->weight_winograd23_data).data) == 1)) {
            if (((*(int *)(p_Var3 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1) &&
                ((*(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
                 (*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)))) &&
               (*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) {
              conv1x1s1_sgemm_pack1to4_int8_sse(&local_688,&local_618,&this->weight_sgemm_data,opt);
              goto LAB_001facda;
            }
            if ((((*(int *)(p_Var3 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1) &&
                 (*(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) &&
                (*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) == 2)) &&
               (*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) == 2)) {
              opt_q.lightmode = false;
              opt_q._1_3_ = 0;
              opt_q.num_threads = 0;
              opt_q.blob_allocator._0_4_ = 0;
              opt_q.blob_allocator._4_4_ = 0;
              opt_q.workspace_allocator._0_4_ = 0;
              opt_q.workspace_allocator._4_4_ = 0;
              opt_q.openmp_blocktime = 0;
              opt_q._32_28_ = ZEXT1228((undefined1  [12])0x0);
              Mat::create((Mat *)&opt_q,local_618.w,local_618.h,local_688.c,local_688.elemsize,
                          local_688.elempack,opt->workspace_allocator);
              uVar44 = 0;
              if ((int)uVar74 < 1) {
                uVar74 = 0;
              }
              uVar64 = (ulong)(uint)iVar88;
              if (iVar88 < 1) {
                uVar64 = uVar44;
              }
              for (; uVar44 != uVar64; uVar44 = uVar44 + 1) {
                puVar53 = (undefined1 *)
                          (local_688.cstep * uVar44 * local_688.elemsize + (long)local_688.data);
                lVar69 = opt_q._0_8_;
                for (uVar73 = 0; uVar73 != uVar74; uVar73 = uVar73 + 1) {
                  puVar79 = puVar53 + (iVar82 - iVar93) * 2;
                  puVar89 = puVar53;
                  for (lVar83 = 0; (int)lVar83 + 3 < iVar93; lVar83 = lVar83 + 4) {
                    *(undefined1 *)(lVar69 + lVar83) = *puVar89;
                    *(undefined1 *)(lVar69 + 1 + lVar83) = puVar89[2];
                    *(undefined1 *)(lVar69 + 2 + lVar83) = puVar89[4];
                    *(undefined1 *)(lVar69 + 3 + lVar83) = puVar89[6];
                    puVar89 = puVar89 + 8;
                    puVar79 = puVar79 + 8;
                  }
                  for (; (int)lVar83 + 1 < iVar93; lVar83 = lVar83 + 2) {
                    *(undefined1 *)(lVar69 + lVar83) = *puVar89;
                    *(undefined1 *)(lVar69 + 1 + lVar83) = puVar89[2];
                    puVar89 = puVar89 + 4;
                    puVar79 = puVar79 + 4;
                  }
                  for (; (int)lVar83 < iVar93; lVar83 = lVar83 + 1) {
                    *(undefined1 *)(lVar69 + lVar83) = puVar53[lVar83 * 2];
                    puVar79 = puVar79 + 2;
                  }
                  lVar69 = lVar69 + lVar83;
                  puVar53 = puVar79;
                }
              }
              conv1x1s1_sgemm_pack1to4_int8_sse
                        ((Mat *)&opt_q,&local_618,&this->weight_sgemm_data,opt);
              piVar78 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
              if (piVar78 != (int *)0x0) {
                LOCK();
                *piVar78 = *piVar78 + -1;
                UNLOCK();
                if (*piVar78 == 0) {
                  if (opt_q._32_8_ == 0) goto LAB_001fb075;
                  (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                }
              }
              goto LAB_001f986c;
            }
          }
LAB_001f9339:
          uVar87 = *(uint *)(p_Var3 + 0x30 + (long)&(this->weight_winograd23_data).data);
          iVar62 = *(int *)(p_Var3 + 0x34 + (long)&(this->weight_winograd23_data).data);
          iVar102 = *(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data);
          iVar105 = *(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data);
          lVar69 = (long)iVar105;
          iVar68 = *(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data);
          lVar83 = (long)local_618.w;
          uVar98 = uVar87 * uVar73;
          if (opt->use_sgemm_convolution == true) {
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator._0_4_ = 0;
            opt_q.blob_allocator._4_4_ = 0;
            opt_q.workspace_allocator._0_4_ = 0;
            opt_q.workspace_allocator._4_4_ = 0;
            opt_q.openmp_blocktime = 0;
            opt_q._32_28_ = ZEXT1228((undefined1  [12])0x0);
            Mat::create((Mat *)&opt_q,local_618.h * local_618.w,uVar98,local_688.c,1,1,
                        opt->workspace_allocator);
            local_640 = (short  [4])&this->weight_sgemm_data;
            lVar83 = (long)(iVar105 * 2);
            uVar64 = 0;
            if ((int)uVar74 < 1) {
              uVar74 = 0;
            }
            if ((int)uVar73 < 1) {
              uVar44 = uVar64;
            }
            uVar103 = (ulong)uVar87;
            if ((int)uVar87 < 1) {
              uVar103 = uVar64;
            }
            uVar106 = (ulong)(uint)iVar88;
            if (iVar88 < 1) {
              uVar106 = uVar64;
            }
            for (; uVar64 != uVar106; uVar64 = uVar64 + 1) {
              lVar51 = opt_q._0_8_;
              for (uVar81 = 0; uVar81 != uVar103; uVar81 = uVar81 + 1) {
                for (uVar52 = 0; uVar52 != uVar44; uVar52 = uVar52 + 1) {
                  puVar53 = (undefined1 *)
                            ((long)local_688.data +
                            uVar52 * (long)iVar62 +
                            (long)local_688.w * local_688.elemsize * (long)iVar102 * uVar81 +
                            local_688.cstep * uVar64 * local_688.elemsize);
                  for (uVar73 = 0; uVar73 != uVar74; uVar73 = uVar73 + 1) {
                    lVar86 = 0;
                    puVar79 = puVar53;
                    for (lVar92 = 0; (int)lVar92 + 3 < iVar93; lVar92 = lVar92 + 4) {
                      *(undefined1 *)(lVar51 + lVar92) = *puVar79;
                      *(undefined1 *)(lVar51 + 1 + lVar92) = puVar79[lVar69];
                      *(undefined1 *)(lVar51 + 2 + lVar92) = puVar79[lVar83];
                      *(undefined1 *)(lVar51 + 3 + lVar92) = puVar79[iVar105 * 3];
                      puVar79 = puVar79 + iVar105 * 4;
                      lVar86 = lVar86 + iVar105 * 4;
                    }
                    for (; (int)lVar92 + 1 < iVar93; lVar92 = lVar92 + 2) {
                      *(undefined1 *)(lVar51 + lVar92) = *puVar79;
                      *(undefined1 *)(lVar51 + 1 + lVar92) = puVar79[lVar69];
                      puVar79 = puVar79 + lVar83;
                      lVar86 = lVar86 + lVar83;
                    }
                    for (; (int)lVar92 < iVar93; lVar92 = lVar92 + 1) {
                      *(undefined1 *)(lVar51 + lVar92) = puVar53[lVar86];
                      lVar86 = lVar86 + lVar69;
                    }
                    puVar53 = puVar53 + lVar86 + (iVar82 * iVar68 - iVar93 * iVar105);
                    lVar51 = lVar51 + lVar92;
                  }
                }
              }
            }
            im2col_sgemm_pack1to4_int8_sse((Mat *)&opt_q,&local_618,(Mat *)local_640,opt);
            piVar78 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
            if (piVar78 != (int *)0x0) {
              LOCK();
              *piVar78 = *piVar78 + -1;
              UNLOCK();
              if (*piVar78 == 0) {
                if (opt_q._32_8_ == 0) goto LAB_001fb075;
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
          }
          else {
            uVar64 = (ulong)(uint)local_618.c;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar98,
                       (allocator_type *)&local_568);
            local_6b8._0_4_ = iVar82 * iVar102 - iVar62 * uVar73;
            uVar48 = 0;
            if ((int)uVar73 < 1) {
              uVar44 = 0;
            }
            if ((int)uVar87 < 1) {
              uVar87 = 0;
            }
            iVar105 = (int)uVar44;
            iVar102 = 0;
            iVar82 = 0;
            for (; uVar48 != uVar87; uVar48 = uVar48 + 1) {
              for (lVar51 = (long)iVar82; (int)uVar44 != lVar51; lVar51 = lVar51 + 1) {
                *(int *)(opt_q._0_8_ + lVar51 * 4) = iVar102;
                iVar102 = iVar102 + iVar62;
              }
              iVar102 = iVar102 + (int)local_6b8;
              uVar44 = (ulong)(uint)((int)uVar44 + iVar105);
              iVar82 = iVar82 + iVar105;
            }
            uVar103 = 0;
            uVar44 = (ulong)uVar98;
            if ((int)uVar98 < 1) {
              uVar44 = uVar103;
            }
            uVar106 = (ulong)(uint)iVar88;
            if (iVar88 < 1) {
              uVar106 = uVar103;
            }
            uVar81 = 0;
            if (0 < iVar93) {
              uVar81 = (ulong)(uint)iVar93;
            }
            uVar52 = (ulong)uVar74;
            if ((int)uVar74 < 1) {
              uVar52 = uVar103;
            }
            if (iVar97 < 1) {
              uVar64 = uVar103;
            }
            for (; uVar103 != uVar64; uVar103 = uVar103 + 1) {
              local_6b8 = (Mat *)(local_618.cstep * uVar103 * local_618.elemsize +
                                 (long)local_618.data);
              for (uVar84 = 0; uVar84 != uVar52; uVar84 = uVar84 + 1) {
                for (uVar80 = 0; uVar80 != uVar81; uVar80 = uVar80 + 1) {
                  pvVar65 = (void *)((this->weight_data_tm).cstep * uVar103 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  auVar124 = ZEXT1664((undefined1  [16])0x0);
                  for (uVar54 = 0; uVar54 != uVar106; uVar54 = uVar54 + 1) {
                    for (uVar90 = 0; uVar44 != uVar90; uVar90 = uVar90 + 1) {
                      auVar113 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)local_688.data +
                                                                          (long)*(int *)(opt_q._0_8_
                                                                                        + uVar90 * 4
                                                                                        ) +
                                                                          local_688.cstep *
                                                                          local_688.elemsize *
                                                                          uVar54 + uVar80 * lVar69 +
                                                                                   (long)local_688.w
                                                                                   * uVar84 * (long)
                                                  iVar68 * local_688.elemsize)),0);
                      auVar110 = vpshufd_avx(auVar113,0);
                      auVar128._8_8_ = 0;
                      auVar128._0_8_ = *(ulong *)((long)pvVar65 + uVar90 * 4);
                      auVar113 = vpcmpgtb_avx((undefined1  [16])0x0,auVar128);
                      auVar113 = vpunpcklbw_avx(auVar128,auVar113);
                      auVar121 = vpmullw_avx(auVar110,auVar113);
                      auVar113 = vpmulhw_avx(auVar110,auVar113);
                      auVar113 = vpunpcklwd_avx(auVar121,auVar113);
                      auVar113 = vpaddd_avx(auVar124._0_16_,auVar113);
                      auVar124 = ZEXT1664(auVar113);
                    }
                    pvVar65 = (void *)((long)pvVar65 + uVar44 * 4);
                  }
                  *(undefined1 (*) [16])((long)local_6b8 + uVar80 * 0x10) = auVar124._0_16_;
                }
                local_6b8 = (Mat *)((long)local_6b8 + lVar83 * 0x10);
              }
            }
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)&opt_q);
          }
        }
      }
LAB_001f986c:
      iVar97 = local_618.c;
      uVar74 = local_618.h;
      iVar93 = local_618.w;
      sVar60 = local_688.cstep;
      iVar88 = local_688.c;
      iVar82 = local_688.w;
      if ((iVar63 == 8) && (local_638._0_4_ == 1)) {
        p_Var3 = this->_vptr_Convolution_x86_fma[-3];
        uVar73 = *(uint *)(p_Var3 + 0x2c + (long)&(this->weight_winograd23_data).data);
        uVar44 = (ulong)uVar73;
        if ((uVar73 == 1) &&
           (*(int *)(p_Var3 + 0x30 + (long)&(this->weight_winograd23_data).data) == 1)) {
          if ((*(int *)(p_Var3 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1) &&
             (((*(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
               (*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
              (*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)))) {
            conv1x1s1_sgemm_pack8to1_int8_sse(&local_688,&local_618,&this->weight_sgemm_data,opt);
          }
          else {
            if ((((*(int *)(p_Var3 + 0x34 + (long)&(this->weight_winograd23_data).data) != 1) ||
                 (*(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data) != 1)) ||
                (*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) != 2)) ||
               (*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) != 2))
            goto LAB_001f9af3;
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator._0_4_ = 0;
            opt_q.blob_allocator._4_4_ = 0;
            opt_q.workspace_allocator._0_4_ = 0;
            opt_q.workspace_allocator._4_4_ = 0;
            opt_q.openmp_blocktime = 0;
            opt_q._32_28_ = ZEXT1228((undefined1  [12])0x0);
            Mat::create((Mat *)&opt_q,local_618.w,local_618.h,local_688.c,local_688.elemsize,
                        local_688.elempack,opt->workspace_allocator);
            uVar64 = 0;
            uVar44 = (ulong)(uint)iVar93;
            if (iVar93 < 1) {
              uVar44 = uVar64;
            }
            if ((int)uVar74 < 1) {
              uVar74 = 0;
            }
            uVar103 = (ulong)(uint)iVar88;
            if (iVar88 < 1) {
              uVar103 = uVar64;
            }
            for (; uVar64 != uVar103; uVar64 = uVar64 + 1) {
              puVar75 = (undefined8 *)
                        (local_688.cstep * uVar64 * local_688.elemsize + (long)local_688.data);
              puVar76 = (undefined8 *)opt_q._0_8_;
              for (uVar73 = 0; uVar106 = uVar44, uVar73 != uVar74; uVar73 = uVar73 + 1) {
                while (iVar63 = (int)uVar106, uVar106 = (ulong)(iVar63 - 1), iVar63 != 0) {
                  *puVar76 = *puVar75;
                  puVar75 = puVar75 + 2;
                  puVar76 = puVar76 + 1;
                }
                puVar75 = puVar75 + (iVar82 - iVar93) * 2;
              }
            }
            conv1x1s1_sgemm_pack8to1_int8_sse((Mat *)&opt_q,&local_618,&this->weight_sgemm_data,opt)
            ;
            piVar78 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
            if (piVar78 != (int *)0x0) {
              LOCK();
              *piVar78 = *piVar78 + -1;
              UNLOCK();
              if (*piVar78 == 0) {
                pvVar65 = (void *)opt_q._0_8_;
                if (opt_q._32_8_ == 0) goto LAB_001fe3a2;
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
          }
        }
        else {
LAB_001f9af3:
          if (((opt->use_winograd_convolution == true) && (uVar73 == 3)) &&
             ((opt->use_winograd43_convolution != false &&
              ((((*(int *)(p_Var3 + 0x30 + (long)&(this->weight_winograd23_data).data) == 3 &&
                 (*(int *)(p_Var3 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1)) &&
                (*(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) &&
               ((*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
                (*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)))))))) {
            iVar82 = cpu_support_x86_avx2();
            if (iVar82 == 0) {
              iVar93 = cpu_support_x86_xop();
              iVar88 = local_618.c;
              iVar63 = local_688.c;
              iVar82 = local_688.elempack;
              if (iVar93 == 0) {
                auVar111._4_4_ = local_618.h;
                auVar111._0_4_ = local_618.w;
                uVar44 = (ulong)local_618.c;
                piVar78 = (int *)CONCAT44(local_688.refcount._4_4_,local_688.refcount._0_4_);
                local_568.data = local_688.data;
                local_568.refcount._0_4_ = local_688.refcount._0_4_;
                local_568.refcount._4_4_ = local_688.refcount._4_4_;
                local_568.elemsize = local_688.elemsize;
                local_568.elempack = local_688.elempack;
                local_568.allocator = local_688.allocator;
                local_568.d = local_688.d;
                local_568.h = local_688.h;
                local_568.dims = local_688.dims;
                local_568.w = local_688.w;
                local_568.c = local_688.c;
                local_568.cstep = local_688.cstep;
                if (piVar78 != (int *)0x0) {
                  LOCK();
                  *piVar78 = *piVar78 + 1;
                  UNLOCK();
                }
                auVar120._8_4_ = 3;
                auVar120._0_8_ = 0x300000003;
                auVar120._12_4_ = 3;
                auVar111._8_8_ = 0;
                auVar113 = vpaddd_avx(auVar111,auVar120);
                auVar121 = vpsrad_avx(auVar113,0x1f);
                auVar121 = vpsrld_avx(auVar121,0x1e);
                auVar113 = vpaddd_avx(auVar113,auVar121);
                auVar124 = ZEXT1664(auVar113);
                auVar112._8_4_ = 0xfffffffc;
                auVar112._0_8_ = 0xfffffffcfffffffc;
                auVar112._12_4_ = 0xfffffffc;
                auVar121 = vpand_avx(auVar113,auVar112);
                local_628 = (void *)(ulong)auVar121._4_4_;
                local_630 = (short  [4])CONCAT44(local_688.refcount._4_4_,auVar121._0_4_);
                iVar97 = auVar121._0_4_ + 2;
                copy_make_border(&local_688,&local_568,0,(auVar121._4_4_ + 2) - local_688.h,0,
                                 iVar97 - local_688.w,0,0.0,opt);
                auVar113 = vpsrad_avx(auVar113,2);
                uVar74 = auVar113._0_4_;
                uVar73 = auVar113._4_4_;
                local_638._0_4_ = uVar74 * 6;
                iVar93 = uVar74 * 6 * uVar73;
                d0[0] = 0;
                d0[1] = 0;
                d0[2] = 0;
                d0[3] = 0;
                iVar62 = (int)((long)iVar93 / 6);
                Mat::create((Mat *)d0,iVar62,0x24,iVar63,(ulong)(uint)(iVar82 * 2),iVar82,
                            opt->workspace_allocator);
                uVar64 = 0;
                if ((int)uVar74 < 1) {
                  uVar74 = 0;
                }
                if ((int)uVar73 < 1) {
                  uVar73 = 0;
                }
                local_620[2] = 0;
                local_620[3] = 0;
                local_620[0] = (short)uVar73;
                local_620[1] = (short)(uVar73 >> 0x10);
                uVar103 = 0;
                if (0 < iVar63) {
                  uVar103 = (ulong)(uint)iVar63;
                }
                auVar114._8_4_ = 0xfffbfffb;
                auVar114._0_8_ = 0xfffbfffbfffbfffb;
                auVar114._12_4_ = 0xfffbfffb;
                for (; auVar113 = auVar124._0_16_, uVar64 != uVar103; uVar64 = uVar64 + 1) {
                  pauVar99 = (undefined1 (*) [16])
                             ((long)local_568.data +
                             local_568.cstep * local_568.elemsize * uVar64 + 0x20);
                  asVar50[0] = 0;
                  asVar50[1] = 0;
                  asVar50[2] = 0;
                  asVar50[3] = 0;
                  for (; asVar50 != local_620; asVar50 = (short  [4])((long)asVar50 + 1)) {
                    pauVar45 = (undefined1 (*) [16])
                               ((long)((local_638._0_4_ * asVar50._0_4_) / 6) * 0x10 + (long)d0);
                    pauVar57 = pauVar99;
                    for (uVar106 = 0; lVar69 = -0x60, pauVar55 = pauVar57, uVar106 != uVar74;
                        uVar106 = uVar106 + 1) {
                      for (; pauVar49 = pauVar45, lVar83 = 0x50, lVar69 != 0; lVar69 = lVar69 + 0x10
                          ) {
                        auVar113 = pauVar55[-2];
                        auVar110 = pauVar55[-1];
                        auVar136 = *pauVar55;
                        auVar122 = vpcmpgtb_avx((undefined1  [16])0x0,auVar113);
                        auVar123 = vpcmpgtb_avx((undefined1  [16])0x0,auVar110);
                        auVar119 = vpcmpgtb_avx((undefined1  [16])0x0,auVar136);
                        auVar133 = vpunpcklbw_avx(auVar113,auVar122);
                        auVar137 = vpunpckhbw_avx(auVar113,auVar122);
                        auVar122 = vpunpcklbw_avx(auVar110,auVar123);
                        auVar123 = vpunpckhbw_avx(auVar110,auVar123);
                        auVar128 = vpunpcklbw_avx(auVar136,auVar119);
                        auVar135 = vpunpckhbw_avx(auVar136,auVar119);
                        auVar113 = vpsllw_avx(auVar133,2);
                        auVar113 = vpaddw_avx(auVar113,auVar128);
                        auVar110 = vpmullw_avx(auVar122,auVar114);
                        auVar113 = vpaddw_avx(auVar113,auVar110);
                        auVar110 = vpaddw_avx(auVar128,auVar123);
                        auVar136 = vpaddw_avx(auVar122,auVar137);
                        auVar136 = vpsllw_avx(auVar136,2);
                        auVar119 = vpsubw_avx(auVar110,auVar136);
                        auVar110 = vpsubw_avx(auVar128,auVar123);
                        auVar136 = vpsubw_avx(auVar137,auVar122);
                        auVar136 = vpsllw_avx(auVar136,2);
                        auVar110 = vpaddw_avx(auVar110,auVar136);
                        auVar122 = vpsubw_avx(auVar128,auVar122);
                        auVar136 = vpsubw_avx(auVar137,auVar123);
                        auVar136 = vpaddw_avx(auVar136,auVar136);
                        auVar133 = vpsubw_avx(auVar122,auVar136);
                        auVar136 = vpaddw_avx(auVar122,auVar136);
                        auVar122 = vpsllw_avx(auVar137,2);
                        auVar122 = vpaddw_avx(auVar122,auVar135);
                        auVar123 = vpmullw_avx(auVar123,auVar114);
                        auVar122 = vpaddw_avx(auVar122,auVar123);
                        auVar124 = ZEXT1664(auVar122);
                        *(undefined1 (*) [16])(auStack_368 + lVar69) = auVar113;
                        *(undefined1 (*) [16])(auStack_308 + lVar69) = auVar119;
                        *(undefined1 (*) [16])(auStack_2a8 + lVar69) = auVar110;
                        *(undefined1 (*) [16])(auStack_248 + lVar69) = auVar133;
                        *(undefined1 (*) [16])(auStack_1e8 + lVar69) = auVar136;
                        *(undefined1 (*) [16])((long)&local_188 + lVar69) = auVar122;
                        pauVar55 = (undefined1 (*) [16])(*pauVar55 + iVar97 * 8);
                      }
                      for (; lVar83 != 0x290; lVar83 = lVar83 + 0x60) {
                        auVar113 = *(undefined1 (*) [16])((long)local_408 + lVar83);
                        auVar110 = *(undefined1 (*) [16])((long)local_3f8 + lVar83);
                        auVar136 = *(undefined1 (*) [16])(auStack_3e8 + lVar83);
                        auVar122 = *(undefined1 (*) [16])((long)w1 + lVar83);
                        auVar123 = vpsllw_avx(*(undefined1 (*) [16])((long)w2 + lVar83),2);
                        auVar119 = vpmullw_avx(auVar110,auVar114);
                        auVar123 = vpaddw_avx(auVar123,auVar122);
                        auVar123 = vpaddw_avx(auVar119,auVar123);
                        auVar124 = ZEXT1664(auVar123);
                        auVar119 = vpaddw_avx(auVar122,auVar136);
                        auVar133 = vpaddw_avx(auVar110,auVar113);
                        auVar133 = vpsllw_avx(auVar133,2);
                        auVar133 = vpsubw_avx(auVar119,auVar133);
                        auVar119 = vpsubw_avx(auVar122,auVar136);
                        auVar137 = vpsubw_avx(auVar113,auVar110);
                        auVar137 = vpsllw_avx(auVar137,2);
                        auVar119 = vpaddw_avx(auVar137,auVar119);
                        auVar122 = vpsubw_avx(auVar122,auVar110);
                        auVar110 = vpsubw_avx(auVar113,auVar136);
                        auVar110 = vpaddw_avx(auVar110,auVar110);
                        auVar137 = vpsubw_avx(auVar122,auVar110);
                        auVar110 = vpaddw_avx(auVar122,auVar110);
                        auVar122 = vpsllw_avx(auVar113,2);
                        auVar113 = vpmullw_avx(auVar136,auVar114);
                        auVar113 = vpaddw_avx(auVar113,auVar122);
                        auVar113 = vpaddw_avx(auVar113,*(undefined1 (*) [16])
                                                        (&opt_q.lightmode + lVar83));
                        *pauVar49 = auVar123;
                        *(undefined1 (*) [16])(*pauVar49 + (long)(iVar62 * 8) * 2) = auVar133;
                        *(undefined1 (*) [16])(*pauVar49 + (long)(iVar62 << 4) * 2) = auVar119;
                        *(undefined1 (*) [16])(*pauVar49 + (long)(iVar62 * 0x18) * 2) = auVar137;
                        *(undefined1 (*) [16])(*pauVar49 + (long)(iVar62 << 5) * 2) = auVar110;
                        *(undefined1 (*) [16])(*pauVar49 + (long)(iVar62 * 0x28) * 2) = auVar113;
                        pauVar49 = (undefined1 (*) [16])(*pauVar49 + (long)(iVar62 * 0x30) * 2);
                      }
                      pauVar57 = pauVar57 + 2;
                      pauVar45 = pauVar45 + 1;
                    }
                    pauVar99 = (undefined1 (*) [16])
                               (*pauVar99 + (long)local_568.w * local_568.elemsize * 4);
                  }
                }
                piVar78 = (int *)CONCAT44(local_568.refcount._4_4_,local_568.refcount._0_4_);
                if (piVar78 != (int *)0x0) {
                  LOCK();
                  *piVar78 = *piVar78 + -1;
                  UNLOCK();
                  if (*piVar78 == 0) {
                    if (local_568.allocator == (Allocator *)0x0) {
                      free(local_568.data);
                    }
                    else {
                      (*(local_568.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                local_568.cstep = 0;
                local_568.data = (void *)0x0;
                local_568.refcount._0_4_ = 0;
                local_568.refcount._4_4_ = 0;
                local_568.elemsize = 0;
                local_568.elempack = 0;
                local_568.h = 0;
                local_568.d = 0;
                local_568.c = 0;
                local_568.allocator = (Allocator *)0x0;
                local_568.dims = 0;
                local_568.w = 0;
                d1[0] = 0;
                d1[1] = 0;
                d1[2] = 0;
                d1[3] = 0;
                opt_q.workspace_allocator._0_4_ = 0;
                opt_q.workspace_allocator._4_4_ = 0;
                opt_q.openmp_blocktime = 0;
                opt_q.lightmode = false;
                opt_q._1_3_ = 0;
                opt_q.num_threads = 0;
                opt_q.blob_allocator._0_4_ = 0;
                opt_q.blob_allocator._4_4_ = 0;
                opt_q._32_28_ = ZEXT1228((undefined1  [12])opt_q._32_12_);
                iVar97 = 0;
                if (0xb < iVar93) {
                  iVar97 = (int)(((long)iVar93 / 6 & 0xffffffffU) >> 1);
                }
                opt_q._32_32_ = ZEXT1632((undefined1  [16])opt_q._48_16_) << 0x80;
                Mat::create((Mat *)&opt_q,iVar63 << (0xb < iVar93),iVar62 - iVar97,0x24,
                            (ulong)(uint)(iVar82 * 2),iVar82,opt->workspace_allocator);
                lVar83 = (long)iVar62;
                for (lVar69 = 0; lVar69 != 0x24; lVar69 = lVar69 + 1) {
                  lVar51 = (long)(int)opt_q._44_4_ *
                           CONCAT44(opt_q.workspace_allocator._4_4_,opt_q.workspace_allocator._0_4_)
                  ;
                  for (uVar64 = 0; (long)(uVar64 | 1) < lVar83; uVar64 = uVar64 + 2) {
                    puVar76 = (undefined8 *)((uVar64 >> 1) * lVar51 + opt_q._0_8_);
                    puVar75 = (undefined8 *)((uVar64 + lVar69 * lVar83) * 0x10 + (long)d0);
                    uVar106 = uVar103;
                    while (iVar82 = (int)uVar106, uVar106 = (ulong)(iVar82 - 1), iVar82 != 0) {
                      uVar41 = puVar75[1];
                      uVar42 = puVar75[2];
                      uVar43 = puVar75[3];
                      *puVar76 = *puVar75;
                      puVar76[1] = uVar41;
                      puVar76[2] = uVar42;
                      puVar76[3] = uVar43;
                      puVar76 = puVar76 + 4;
                    }
                  }
                  for (; (long)uVar64 < lVar83; uVar64 = uVar64 + 1) {
                    puVar76 = (undefined8 *)
                              ((ulong)(((uint)uVar64 & 1) + ((uint)(uVar64 >> 1) & 0x7fffffff)) *
                               lVar51 + opt_q._0_8_);
                    puVar75 = (undefined8 *)((uVar64 + lVar69 * lVar83) * 0x10 + (long)d0);
                    uVar106 = uVar103;
                    while (iVar82 = (int)uVar106, uVar106 = (ulong)(iVar82 - 1), iVar82 != 0) {
                      uVar41 = puVar75[1];
                      *puVar76 = *puVar75;
                      puVar76[1] = uVar41;
                      puVar76 = puVar76 + 2;
                    }
                  }
                }
                d0[0] = 0;
                d0[1] = 0;
                d0[2] = 0;
                d0[3] = 0;
                auVar124 = ZEXT1664(auVar113);
                Mat::create((Mat *)d1,iVar62,0x24,iVar88,4,1,opt->workspace_allocator);
                pvVar65 = (this->weight_winograd43_data).data;
                sVar60 = (this->weight_winograd43_data).elemsize;
                uVar106 = 0;
                uVar64 = (ulong)(uint)(iVar88 >> 2);
                if (iVar88 >> 2 < 1) {
                  uVar64 = uVar106;
                }
                local_640 = (short  [4])((this->weight_winograd43_data).cstep * sVar60);
                for (; uVar106 != uVar64; uVar106 = uVar106 + 1) {
                  iVar82 = (this->weight_winograd43_data).w;
                  asVar46 = d1;
                  pvVar56 = pvVar65;
                  asVar71 = d1;
                  asVar77 = d1;
                  asVar108 = d1;
                  for (lVar69 = 0; lVar69 != 0x24; lVar69 = lVar69 + 1) {
                    lVar92 = (long)(int)opt_q._44_4_ *
                             CONCAT44(opt_q.workspace_allocator._4_4_,
                                      opt_q.workspace_allocator._0_4_);
                    lVar51 = opt_q._0_8_;
                    for (uVar81 = 0; (long)(uVar81 | 1) < lVar83; uVar81 = uVar81 + 2) {
                      auVar124 = ZEXT1664((undefined1  [16])0x0);
                      lVar86 = 0;
                      auVar125 = ZEXT1664((undefined1  [16])0x0);
                      auVar127 = ZEXT1664((undefined1  [16])0x0);
                      auVar129 = ZEXT1664((undefined1  [16])0x0);
                      auVar130 = ZEXT1664((undefined1  [16])0x0);
                      auVar131 = ZEXT1664((undefined1  [16])0x0);
                      auVar132 = ZEXT1664((undefined1  [16])0x0);
                      auVar134 = ZEXT1664((undefined1  [16])0x0);
                      uVar52 = uVar103;
                      while( true ) {
                        iVar63 = (int)uVar52;
                        uVar52 = (ulong)(iVar63 - 1);
                        auVar133 = auVar132._0_16_;
                        auVar137 = auVar134._0_16_;
                        auVar123 = auVar130._0_16_;
                        auVar119 = auVar131._0_16_;
                        auVar136 = auVar127._0_16_;
                        auVar122 = auVar129._0_16_;
                        auVar113 = auVar124._0_16_;
                        auVar110 = auVar125._0_16_;
                        if (iVar63 == 0) break;
                        auVar135 = *(undefined1 (*) [16])(lVar51 + lVar86);
                        auVar128 = *(undefined1 (*) [16])(lVar51 + 0x10 + lVar86);
                        auVar115 = *(undefined1 (*) [16])((long)pvVar56 + lVar86 * 2);
                        auVar116 = *(undefined1 (*) [16])((long)pvVar56 + lVar86 * 2 + 0x10);
                        auVar118 = *(undefined1 (*) [16])((long)pvVar56 + lVar86 * 2 + 0x20);
                        auVar126 = *(undefined1 (*) [16])((long)pvVar56 + lVar86 * 2 + 0x30);
                        auVar111 = vpmaddwd_avx(auVar135,auVar115);
                        auVar137 = vpaddd_avx(auVar111,auVar137);
                        auVar134 = ZEXT1664(auVar137);
                        auVar137 = vpmaddwd_avx(auVar135,auVar116);
                        auVar133 = vpaddd_avx(auVar137,auVar133);
                        auVar132 = ZEXT1664(auVar133);
                        auVar133 = vpmaddwd_avx(auVar135,auVar118);
                        auVar119 = vpaddd_avx(auVar133,auVar119);
                        auVar131 = ZEXT1664(auVar119);
                        auVar119 = vpmaddwd_avx(auVar135,auVar126);
                        auVar123 = vpaddd_avx(auVar119,auVar123);
                        auVar130 = ZEXT1664(auVar123);
                        auVar123 = vpmaddwd_avx(auVar128,auVar115);
                        auVar122 = vpaddd_avx(auVar123,auVar122);
                        auVar129 = ZEXT1664(auVar122);
                        auVar122 = vpmaddwd_avx(auVar128,auVar116);
                        auVar136 = vpaddd_avx(auVar122,auVar136);
                        auVar127 = ZEXT1664(auVar136);
                        auVar136 = vpmaddwd_avx(auVar128,auVar118);
                        auVar110 = vpaddd_avx(auVar136,auVar110);
                        auVar125 = ZEXT1664(auVar110);
                        auVar110 = vpmaddwd_avx(auVar128,auVar126);
                        auVar113 = vpaddd_avx(auVar110,auVar113);
                        auVar124 = ZEXT1664(auVar113);
                        lVar86 = lVar86 + 0x20;
                      }
                      auVar135 = vpunpckldq_avx(auVar137,auVar133);
                      auVar128 = vpunpckldq_avx(auVar119,auVar123);
                      auVar133 = vpunpckhdq_avx(auVar137,auVar133);
                      auVar123 = vpunpckhdq_avx(auVar119,auVar123);
                      auVar119 = vpunpckldq_avx(auVar122,auVar136);
                      auVar137 = vpunpckldq_avx(auVar110,auVar113);
                      auVar136 = vpunpckhdq_avx(auVar122,auVar136);
                      auVar122 = vpunpckhdq_avx(auVar110,auVar113);
                      auVar110 = vpunpcklqdq_avx(auVar135,auVar128);
                      auVar113 = vpunpckhqdq_avx(auVar135,auVar128);
                      auVar113 = vpaddd_avx(auVar110,auVar113);
                      auVar135 = vpunpcklqdq_avx(auVar133,auVar123);
                      auVar110 = vpunpckhqdq_avx(auVar133,auVar123);
                      auVar110 = vpaddd_avx(auVar110,auVar135);
                      auVar113 = vpaddd_avx(auVar113,auVar110);
                      auVar124 = ZEXT1664(auVar113);
                      auVar123 = vpunpcklqdq_avx(auVar119,auVar137);
                      auVar110 = vpunpckhqdq_avx(auVar119,auVar137);
                      auVar110 = vpaddd_avx(auVar123,auVar110);
                      auVar123 = vpunpcklqdq_avx(auVar136,auVar122);
                      *(int *)asVar77 = auVar113._0_4_;
                      *(int *)asVar71 = auVar113._4_4_;
                      *(int *)asVar108 = auVar113._8_4_;
                      *(int *)asVar46 = auVar113._12_4_;
                      auVar113 = vpunpckhqdq_avx(auVar136,auVar122);
                      auVar113 = vpaddd_avx(auVar113,auVar123);
                      auVar113 = vpaddd_avx(auVar110,auVar113);
                      *(int *)((long)asVar77 + 4) = auVar113._0_4_;
                      *(int *)((long)asVar71 + 4) = auVar113._4_4_;
                      *(int *)((long)asVar108 + 4) = auVar113._8_4_;
                      *(int *)((long)asVar46 + 4) = auVar113._12_4_;
                      asVar77 = (short  [4])((long)asVar77 + 8);
                      asVar71 = (short  [4])((long)asVar71 + 8);
                      asVar108 = (short  [4])((long)asVar108 + 8);
                      asVar46 = (short  [4])((long)asVar46 + 8);
                      lVar51 = lVar51 + lVar92;
                    }
                    while (uVar73 = (uint)uVar81, (int)uVar73 < iVar62) {
                      auVar124 = ZEXT1664((undefined1  [16])0x0);
                      lVar51 = 0;
                      auVar125 = ZEXT1664((undefined1  [16])0x0);
                      auVar127 = ZEXT1664((undefined1  [16])0x0);
                      auVar129 = ZEXT1664((undefined1  [16])0x0);
                      uVar52 = uVar103;
                      while( true ) {
                        iVar63 = (int)uVar52;
                        uVar52 = (ulong)(iVar63 - 1);
                        auVar113 = auVar124._0_16_;
                        auVar110 = auVar125._0_16_;
                        auVar136 = auVar127._0_16_;
                        auVar122 = auVar129._0_16_;
                        if (iVar63 == 0) break;
                        auVar123 = *(undefined1 (*) [16])
                                    ((ulong)((uVar73 & 1) + ((uint)(uVar81 >> 1) & 0x7fffffff)) *
                                     lVar92 + opt_q._0_8_ + lVar51);
                        auVar119 = vpmaddwd_avx(auVar123,*(undefined1 (*) [16])
                                                          ((long)pvVar56 + lVar51 * 4));
                        auVar113 = vpaddd_avx(auVar119,auVar113);
                        auVar124 = ZEXT1664(auVar113);
                        auVar113 = vpmaddwd_avx(auVar123,*(undefined1 (*) [16])
                                                          ((long)pvVar56 + lVar51 * 4 + 0x10));
                        auVar113 = vpaddd_avx(auVar113,auVar110);
                        auVar125 = ZEXT1664(auVar113);
                        auVar113 = vpmaddwd_avx(auVar123,*(undefined1 (*) [16])
                                                          ((long)pvVar56 + lVar51 * 4 + 0x20));
                        auVar113 = vpaddd_avx(auVar113,auVar136);
                        auVar127 = ZEXT1664(auVar113);
                        auVar113 = vpmaddwd_avx(auVar123,*(undefined1 (*) [16])
                                                          ((long)pvVar56 + lVar51 * 4 + 0x30));
                        auVar113 = vpaddd_avx(auVar113,auVar122);
                        auVar129 = ZEXT1664(auVar113);
                        lVar51 = lVar51 + 0x10;
                      }
                      auVar123 = vpunpckldq_avx(auVar113,auVar110);
                      auVar119 = vpunpckldq_avx(auVar136,auVar122);
                      auVar110 = vpunpckhdq_avx(auVar113,auVar110);
                      auVar136 = vpunpckhdq_avx(auVar136,auVar122);
                      auVar124 = ZEXT1664(auVar136);
                      auVar122 = vpunpcklqdq_avx(auVar123,auVar119);
                      auVar113 = vpunpckhqdq_avx(auVar123,auVar119);
                      auVar113 = vpaddd_avx(auVar122,auVar113);
                      auVar122 = vpunpcklqdq_avx(auVar110,auVar136);
                      auVar110 = vpunpckhqdq_avx(auVar110,auVar136);
                      auVar110 = vpaddd_avx(auVar110,auVar122);
                      auVar113 = vpaddd_avx(auVar113,auVar110);
                      *(int *)asVar77 = auVar113._0_4_;
                      *(int *)asVar71 = auVar113._4_4_;
                      *(int *)asVar108 = auVar113._8_4_;
                      *(int *)asVar46 = auVar113._12_4_;
                      asVar77 = (short  [4])((long)asVar77 + 4);
                      asVar71 = (short  [4])((long)asVar71 + 4);
                      asVar108 = (short  [4])((long)asVar108 + 4);
                      asVar46 = (short  [4])((long)asVar46 + 4);
                      uVar81 = (ulong)(uVar73 + 1);
                    }
                    pvVar56 = (void *)((long)pvVar56 + (long)iVar82 * sVar60);
                  }
                  pvVar65 = (void *)((long)pvVar65 + (long)local_640);
                }
                pvVar65 = (this->weight_winograd43_data).data;
                sVar60 = (this->weight_winograd43_data).elemsize;
                sVar96 = (this->weight_winograd43_data).cstep;
                for (uVar64 = uVar44 & 0xfffffffffffffffc; auVar113 = auVar124._0_16_,
                    (long)uVar64 < (long)uVar44; uVar64 = uVar64 + 1) {
                  uVar106 = (ulong)(uint)((int)uVar64 >> 0x1f) << 0x20 | uVar64 & 0xffffffff;
                  iVar82 = (this->weight_winograd43_data).w;
                  pvVar56 = (void *)((long)((int)((long)uVar106 % 4) + (int)((long)uVar106 / 4)) *
                                     sVar96 * sVar60 + (long)pvVar65);
                  asVar46 = d1;
                  for (lVar69 = 0; lVar69 != 0x24; lVar69 = lVar69 + 1) {
                    lVar92 = (long)(int)opt_q._44_4_ *
                             CONCAT44(opt_q.workspace_allocator._4_4_,
                                      opt_q.workspace_allocator._0_4_);
                    lVar51 = opt_q._0_8_;
                    for (uVar106 = 0; (long)(uVar106 | 1) < lVar83; uVar106 = uVar106 + 2) {
                      auVar124 = ZEXT1664((undefined1  [16])0x0);
                      lVar86 = 0;
                      auVar125 = ZEXT1664((undefined1  [16])0x0);
                      uVar81 = uVar103;
                      while( true ) {
                        iVar63 = (int)uVar81;
                        uVar81 = (ulong)(iVar63 - 1);
                        auVar113 = auVar124._0_16_;
                        auVar110 = auVar125._0_16_;
                        if (iVar63 == 0) break;
                        auVar136 = vpmaddwd_avx(*(undefined1 (*) [16])((long)pvVar56 + lVar86),
                                                *(undefined1 (*) [16])(lVar51 + lVar86 * 2));
                        auVar113 = vpaddd_avx(auVar136,auVar113);
                        auVar124 = ZEXT1664(auVar113);
                        auVar113 = vpmaddwd_avx(*(undefined1 (*) [16])((long)pvVar56 + lVar86),
                                                *(undefined1 (*) [16])(lVar51 + 0x10 + lVar86 * 2));
                        auVar113 = vpaddd_avx(auVar113,auVar110);
                        auVar125 = ZEXT1664(auVar113);
                        lVar86 = lVar86 + 0x10;
                      }
                      auVar136 = vpshufd_avx(auVar113,0xee);
                      auVar113 = vpaddd_avx(auVar136,auVar113);
                      auVar136 = vpshufd_avx(auVar110,0xee);
                      auVar110 = vpaddd_avx(auVar136,auVar110);
                      auVar124 = ZEXT1664(auVar110);
                      auVar113 = vphaddd_avx(auVar113,auVar110);
                      auVar113 = vpshufd_avx(auVar113,0xe8);
                      *(long *)asVar46 = auVar113._0_8_;
                      asVar46 = (short  [4])((long)asVar46 + 8);
                      lVar51 = lVar51 + lVar92;
                    }
                    while (uVar73 = (uint)uVar106, (int)uVar73 < iVar62) {
                      auVar125 = ZEXT1664((undefined1  [16])0x0);
                      lVar51 = 0;
                      uVar81 = uVar103;
                      while( true ) {
                        iVar63 = (int)uVar81;
                        uVar81 = (ulong)(iVar63 - 1);
                        auVar113 = auVar125._0_16_;
                        if (iVar63 == 0) break;
                        auVar110 = vpmaddwd_avx(*(undefined1 (*) [16])
                                                 ((ulong)((uVar73 & 1) +
                                                         ((uint)(uVar106 >> 1) & 0x7fffffff)) *
                                                  lVar92 + opt_q._0_8_ + lVar51),
                                                *(undefined1 (*) [16])((long)pvVar56 + lVar51));
                        auVar124 = ZEXT1664(auVar110);
                        auVar113 = vpaddd_avx(auVar110,auVar113);
                        auVar125 = ZEXT1664(auVar113);
                        lVar51 = lVar51 + 0x10;
                      }
                      auVar113 = vphaddd_avx(auVar113,auVar113);
                      auVar113 = vphaddd_avx(auVar113,auVar113);
                      *(int *)asVar46 = auVar113._0_4_;
                      asVar46 = (short  [4])((long)asVar46 + 4);
                      uVar106 = (ulong)(uVar73 + 1);
                    }
                    pvVar56 = (void *)((long)pvVar56 + (long)iVar82 * sVar60);
                  }
                }
                piVar78 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
                if (piVar78 != (int *)0x0) {
                  LOCK();
                  *piVar78 = *piVar78 + -1;
                  UNLOCK();
                  if (*piVar78 == 0) {
                    if (opt_q._32_8_ == 0) {
                      free((void *)opt_q._0_8_);
                    }
                    else {
                      (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                      auVar125._8_56_ = extraout_var_00;
                      auVar125._0_8_ = extraout_XMM1_Qa_00;
                      auVar113 = auVar125._0_16_;
                    }
                  }
                }
                d0[0] = 0;
                d0[1] = 0;
                d0[2] = 0;
                d0[3] = 0;
                opt_b.lightmode = false;
                opt_b._1_3_ = 0;
                opt_b.num_threads = 0;
                opt_b.blob_allocator._0_4_ = 0;
                opt_b.blob_allocator._4_4_ = 0;
                opt_b.workspace_allocator = (Allocator *)0x0;
                opt_b.openmp_blocktime = 0;
                opt_b.use_bf16_storage = false;
                opt_b.use_fp16_packed = false;
                opt_b.use_fp16_storage = false;
                opt_b.use_fp16_arithmetic = false;
                opt_b.use_int8_packed = false;
                opt_b.use_int8_storage = false;
                opt_b.use_int8_arithmetic = false;
                opt_b.use_packing_layout = false;
                opt_b.use_shader_pack8 = false;
                opt_b.use_subgroup_basic = false;
                opt_b.use_subgroup_vote = false;
                opt_b.use_subgroup_ballot = false;
                opt_b.use_subgroup_shuffle = false;
                opt_b.use_image_storage = false;
                opt_b.use_tensor_storage = false;
                opt_b.use_reserved_0 = false;
                opt_b.flush_denormals = 0;
                opt_b.use_local_pool_allocator = false;
                opt_b.use_shader_local_memory = false;
                opt_b.use_cooperative_matrix = false;
                opt_b.use_winograd23_convolution = false;
                opt_b.use_winograd43_convolution = false;
                opt_b.use_winograd63_convolution = false;
                opt_b.use_a53_a55_optimized_kernel = false;
                opt_b.use_reserved_7 = false;
                auVar117._4_4_ = local_618.h;
                auVar117._0_4_ = local_618.w;
                auVar117._8_8_ = 0;
                auVar121 = vpcmpeqd_avx(auVar117,auVar121);
                auVar121 = vpmovsxdq_avx(auVar121);
                auVar113 = vpcmpeqd_avx(auVar113,auVar113);
                if (((auVar113 & ~auVar121) >> 0x3f & (undefined1  [16])0x1) ==
                    (undefined1  [16])0x0 && -1 < SUB161(auVar113 & ~auVar121,0xf)) {
                  piVar78 = (int *)CONCAT44(local_618.refcount._4_4_,local_618.refcount._0_4_);
                  if (piVar78 != (int *)0x0) {
                    LOCK();
                    *piVar78 = *piVar78 + 1;
                    UNLOCK();
                  }
                  opt_b._0_8_ = local_618.data;
                  opt_b.blob_allocator._0_4_ = local_618.refcount._0_4_;
                  opt_b.blob_allocator._4_4_ = local_618.refcount._4_4_;
                  opt_b.workspace_allocator = (Allocator *)local_618.elemsize;
                  opt_b.openmp_blocktime = local_618.elempack;
                  opt_b._32_8_ = local_618.allocator;
                  opt_b.use_shader_pack8 = (bool)(undefined1)local_618.dims;
                  opt_b.use_subgroup_basic = (bool)local_618.dims._1_1_;
                  opt_b.use_subgroup_vote = (bool)local_618.dims._2_1_;
                  opt_b.use_subgroup_ballot = (bool)local_618.dims._3_1_;
                  opt_b.use_subgroup_shuffle = (bool)(undefined1)local_618.w;
                  opt_b.use_image_storage = (bool)local_618.w._1_1_;
                  opt_b.use_tensor_storage = (bool)local_618.w._2_1_;
                  opt_b.use_reserved_0 = (bool)local_618.w._3_1_;
                  opt_b.flush_denormals = local_618.h;
                  opt_b.use_local_pool_allocator = (bool)(undefined1)local_618.d;
                  opt_b.use_shader_local_memory = (bool)local_618.d._1_1_;
                  opt_b.use_cooperative_matrix = (bool)local_618.d._2_1_;
                  opt_b.use_winograd23_convolution = (bool)local_618.d._3_1_;
                  opt_b.use_winograd43_convolution = (bool)(undefined1)local_618.c;
                  opt_b.use_winograd63_convolution = (bool)local_618.c._1_1_;
                  opt_b.use_a53_a55_optimized_kernel = (bool)local_618.c._2_1_;
                  opt_b.use_reserved_7 = (bool)local_618.c._3_1_;
                  local_518[0] = (undefined2)local_618.cstep;
                  local_518[1] = local_618.cstep._2_2_;
                  local_518[2] = local_618.cstep._4_2_;
                  local_518[3] = local_618.cstep._6_2_;
                }
                else {
                  Mat::create((Mat *)&opt_b,local_630._0_4_,(int)local_628,iVar88,4,1,
                              opt->workspace_allocator);
                  local_518[0] = 0;
                  local_518[1] = 0;
                  local_518[2] = 0;
                  local_518[3] = 0;
                }
                uVar44 = (ulong)(uint)iVar88;
                if (iVar88 < 1) {
                  uVar44 = 0;
                }
                lVar69 = (long)(int)local_630._0_4_;
                local_3f8[0] = 0;
                local_3f8[1] = 0;
                local_3f8[2] = 0;
                local_3f8[3] = 0;
                lVar51 = (long)(iVar62 * 6) * 4;
                local_628 = (void *)((long)d1 + (long)(iVar62 * 2) * 4);
                local_5c8 = (void *)((long)d1 + (long)(iVar62 * 3) * 4);
                local_630[0] = d1[0];
                local_630[1] = d1[1];
                local_630[2] = d1[2];
                local_630[3] = d1[3];
                local_5c0 = (long)d1 + (long)(iVar62 * 5) * 4;
                local_5d0 = (int *)(opt_b._0_8_ + 0xc);
                local_518 = (short  [4])((long)local_518 * (long)opt_b.workspace_allocator);
                local_408 = (short  [4])((long)opt_b.workspace_allocator * 4);
                for (uVar64 = 0; uVar64 != uVar44; uVar64 = uVar64 + 1) {
                  local_6a0 = local_5d0;
                  asVar58[0] = 0;
                  asVar58[1] = 0;
                  asVar58[2] = 0;
                  asVar58[3] = 0;
                  local_510 = uVar64;
                  while (asVar46 = asVar58, asVar46 != local_620) {
                    lVar101 = (long)((local_638._0_4_ * asVar46._0_4_) / 6);
                    asVar71 = d1;
                    uVar64 = local_5c0;
                    sVar60 = (size_t)local_628;
                    lVar92 = (long)d1 + (long)(iVar62 * 4) * 4;
                    piVar78 = local_6a0;
                    sVar96 = (size_t)local_5c8;
                    lVar86 = (long)d1 + lVar83 * 4;
                    for (uVar103 = 0; uVar103 != uVar74; uVar103 = uVar103 + 1) {
                      asVar77 = asVar71;
                      uVar106 = uVar64;
                      sVar59 = sVar60;
                      lVar72 = lVar92;
                      sVar95 = sVar96;
                      lVar109 = lVar86;
                      for (lVar66 = -5; lVar66 != 0; lVar66 = lVar66 + 1) {
                        iVar88 = *(int *)(lVar109 + lVar101 * 4);
                        iVar63 = *(int *)(sVar59 + lVar101 * 4);
                        iVar82 = iVar63 + iVar88;
                        iVar88 = iVar88 - iVar63;
                        iVar93 = *(int *)(sVar95 + lVar101 * 4);
                        iVar97 = *(int *)(lVar72 + lVar101 * 4);
                        iVar63 = iVar97 + iVar93;
                        iVar93 = iVar93 - iVar97;
                        *(int *)((long)&opt_q.workspace_allocator + lVar66 * 4 + 4) =
                             iVar82 + *(int *)((long)asVar77 + lVar101 * 4) + iVar63;
                        *(int *)(&opt_q.use_subgroup_shuffle + lVar66 * 4) = iVar88 + iVar93 * 2;
                        aiStack_380[lVar66 + -1] = iVar82 + iVar63 * 4;
                        *(int *)(auStack_368 + lVar66 * 4 + -4) =
                             iVar88 + iVar93 * 8 + *(int *)(uVar106 + lVar101 * 4) * 4;
                        asVar77 = (short  [4])((long)asVar77 + lVar51);
                        lVar109 = lVar109 + lVar51;
                        sVar59 = sVar59 + lVar51;
                        sVar95 = sVar95 + lVar51;
                        lVar72 = lVar72 + lVar51;
                        uVar106 = uVar106 + lVar51;
                      }
                      iVar82 = *(int *)(sVar95 + lVar101 * 4);
                      iVar63 = *(int *)(lVar72 + lVar101 * 4);
                      iVar97 = iVar82 - iVar63;
                      iVar88 = *(int *)(lVar109 + lVar101 * 4);
                      iVar93 = *(int *)(sVar59 + lVar101 * 4);
                      iVar102 = iVar88 - iVar93;
                      opt_q.workspace_allocator._4_4_ =
                           (iVar93 + iVar88 + iVar63 + iVar82 +
                           *(int *)((long)asVar77 + lVar101 * 4)) * 4;
                      opt_q._44_4_ = iVar97 * 8 + iVar102 * 4;
                      local_378._12_4_ =
                           *(int *)(uVar106 + lVar101 * 4) * 0x10 + iVar97 * 0x20 + iVar102 * 4;
                      piVar67 = piVar78;
                      for (lVar66 = 0x14; lVar66 != 0x74; lVar66 = lVar66 + 0x18) {
                        iVar88 = *(int *)((long)w1 + lVar66 + 4);
                        iVar82 = iVar88 + *(int *)((long)w1 + lVar66);
                        iVar88 = *(int *)((long)w1 + lVar66) - iVar88;
                        iVar93 = *(int *)((long)aiStack_3d0 + lVar66 + 4);
                        iVar63 = iVar93 + *(int *)((long)aiStack_3d0 + lVar66);
                        iVar93 = *(int *)((long)aiStack_3d0 + lVar66) - iVar93;
                        piVar67[-3] = (*(int *)((long)w1 + lVar66 + -4) + iVar82 + iVar63) / 0x240;
                        piVar67[-2] = (iVar88 + iVar93 * 2) / 0x240;
                        piVar67[-1] = (iVar82 + iVar63 * 4) / 0x240;
                        *piVar67 = (iVar88 + iVar93 * 8 + *(int *)(&opt_q.lightmode + lVar66)) /
                                   0x240;
                        piVar67 = piVar67 + lVar69;
                      }
                      asVar71 = (short  [4])((long)asVar71 + 4);
                      lVar86 = lVar86 + 4;
                      sVar60 = sVar60 + 4;
                      sVar96 = sVar96 + 4;
                      lVar92 = lVar92 + 4;
                      uVar64 = uVar64 + 4;
                      piVar78 = piVar78 + 4;
                    }
                    local_6a0 = (int *)((long)local_6a0 +
                                       (long)(int)opt_b._44_4_ * (long)opt_b.workspace_allocator * 4
                                       );
                    uVar64 = local_510;
                    local_640 = asVar46;
                    asVar58 = (short  [4])((long)asVar46 + 1);
                  }
                  local_5d0 = (int *)((long)local_5d0 + (long)local_518);
                }
                copy_cut_border((Mat *)&opt_b,&local_618,0,opt_b.flush_denormals - local_618.h,0,
                                opt_b._44_4_ - local_618.w,opt);
                piVar78 = (int *)CONCAT44(opt_b.blob_allocator._4_4_,opt_b.blob_allocator._0_4_);
                if (piVar78 != (int *)0x0) {
                  LOCK();
                  *piVar78 = *piVar78 + -1;
                  UNLOCK();
                  if (*piVar78 == 0) {
                    if (opt_b._32_8_ == 0) {
                      free((void *)opt_b._0_8_);
                    }
                    else {
                      (**(code **)(*(long *)opt_b._32_8_ + 0x18))();
                    }
                  }
                }
                piVar78 = (int *)CONCAT44(local_568.refcount._4_4_,local_568.refcount._0_4_);
                if (piVar78 != (int *)0x0) {
                  LOCK();
                  *piVar78 = *piVar78 + -1;
                  UNLOCK();
                  if (*piVar78 == 0) {
                    pvVar65 = local_568.data;
                    if (local_568.allocator == (Allocator *)0x0) goto LAB_001fe3a2;
                    (*(local_568.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              else {
                conv3x3s1_winograd43_pack8to1_int8_sse_xop
                          (&local_688,&local_618,&this->weight_winograd43_data,opt);
              }
            }
            else {
              conv3x3s1_winograd43_pack8to1_int8_sse_avx2
                        (&local_688,&local_618,&this->weight_winograd43_data,opt);
            }
          }
          else {
            uVar87 = *(uint *)(p_Var3 + 0x30 + (long)&(this->weight_winograd23_data).data);
            iVar63 = *(int *)(p_Var3 + 0x34 + (long)&(this->weight_winograd23_data).data);
            iVar62 = *(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data);
            iVar102 = *(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data);
            iVar105 = *(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data);
            lVar69 = (long)local_618.w;
            uVar98 = uVar87 * uVar73;
            if (opt->use_sgemm_convolution == true) {
              opt_q.lightmode = false;
              opt_q._1_3_ = 0;
              opt_q.num_threads = 0;
              opt_q.blob_allocator._0_4_ = 0;
              opt_q.blob_allocator._4_4_ = 0;
              opt_q.workspace_allocator._0_4_ = 0;
              opt_q.workspace_allocator._4_4_ = 0;
              opt_q.openmp_blocktime = 0;
              opt_q._32_28_ = ZEXT1228((undefined1  [12])0x0);
              Mat::create((Mat *)&opt_q,local_618.h * local_618.w,uVar98,local_688.c,8,8,
                          opt->workspace_allocator);
              uVar64 = 0;
              uVar98 = iVar93;
              if (iVar93 < 1) {
                uVar98 = 0;
              }
              if ((int)uVar74 < 1) {
                uVar74 = 0;
              }
              if ((int)uVar73 < 1) {
                uVar44 = uVar64;
              }
              uVar103 = (ulong)uVar87;
              if ((int)uVar87 < 1) {
                uVar103 = uVar64;
              }
              uVar106 = (ulong)(uint)iVar88;
              if (iVar88 < 1) {
                uVar106 = uVar64;
              }
              for (; uVar64 != uVar106; uVar64 = uVar64 + 1) {
                puVar76 = (undefined8 *)opt_q._0_8_;
                for (uVar81 = 0; uVar81 != uVar103; uVar81 = uVar81 + 1) {
                  for (uVar52 = 0; uVar52 != uVar44; uVar52 = uVar52 + 1) {
                    puVar75 = (undefined8 *)
                              ((long)local_688.data +
                              uVar52 * (long)iVar63 * 8 +
                              local_688.elemsize * (long)local_688.w * (long)iVar62 * uVar81 +
                              local_688.cstep * uVar64 * local_688.elemsize);
                    for (uVar73 = 0; uVar87 = uVar98, uVar73 != uVar74; uVar73 = uVar73 + 1) {
                      while (uVar87 != 0) {
                        *puVar76 = *puVar75;
                        puVar76 = puVar76 + 1;
                        puVar75 = puVar75 + iVar102;
                        uVar87 = uVar87 - 1;
                      }
                      puVar75 = puVar75 + ((long)(iVar82 * iVar105) - (long)(iVar102 * iVar93));
                    }
                  }
                }
              }
              im2col_sgemm_pack8to1_int8_sse((Mat *)&opt_q,&local_618,&this->weight_sgemm_data,opt);
              piVar78 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
              if (piVar78 != (int *)0x0) {
                LOCK();
                *piVar78 = *piVar78 + -1;
                UNLOCK();
                if (*piVar78 == 0) {
                  pvVar65 = (void *)opt_q._0_8_;
                  if (opt_q._32_8_ == 0) {
LAB_001fe3a2:
                    free(pvVar65);
                  }
                  else {
                    (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                  }
                }
              }
            }
            else {
              uVar64 = (ulong)(uint)local_618.c;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar98,
                         (allocator_type *)&local_568);
              uVar48 = 0;
              if ((int)uVar73 < 1) {
                uVar44 = 0;
              }
              if ((int)uVar87 < 1) {
                uVar87 = uVar48;
              }
              iVar61 = 0;
              uVar103 = uVar44;
              iVar68 = 0;
              for (; uVar48 != uVar87; uVar48 = uVar48 + 1) {
                for (lVar83 = (long)iVar68; (int)uVar103 != lVar83; lVar83 = lVar83 + 1) {
                  *(int *)(opt_q._0_8_ + lVar83 * 4) = iVar61;
                  iVar61 = iVar61 + iVar63;
                }
                iVar61 = iVar61 + (iVar82 * iVar62 - iVar63 * uVar73);
                uVar103 = (ulong)(uint)((int)uVar103 + (int)uVar44);
                iVar68 = iVar68 + (int)uVar44;
              }
              if ((int)uVar98 < 1) {
                uVar98 = 0;
              }
              uVar44 = (ulong)(uint)iVar88;
              if (iVar88 < 1) {
                uVar44 = 0;
              }
              uVar103 = 0;
              if (0 < iVar93) {
                uVar103 = (ulong)(uint)iVar93;
              }
              if ((int)uVar74 < 1) {
                uVar74 = 0;
              }
              if (iVar97 < 1) {
                uVar64 = 0;
              }
              for (uVar106 = 0; uVar106 != uVar64; uVar106 = uVar106 + 1) {
                local_700 = (Mat *)(local_618.elemsize * local_618.cstep * uVar106 +
                                   (long)local_618.data);
                for (uVar81 = 0; uVar81 != uVar74; uVar81 = uVar81 + 1) {
                  sVar60 = (this->weight_data_tm).cstep;
                  sVar96 = (this->weight_data_tm).elemsize;
                  pvVar65 = (this->weight_data_tm).data;
                  for (uVar52 = 0; uVar52 != uVar103; uVar52 = uVar52 + 1) {
                    iVar82 = 0;
                    pvVar56 = (void *)(sVar60 * uVar106 * sVar96 + (long)pvVar65);
                    for (uVar84 = 0; uVar84 != uVar44; uVar84 = uVar84 + 1) {
                      for (uVar80 = 0; uVar98 != uVar80; uVar80 = uVar80 + 1) {
                        auVar118._8_8_ = 0;
                        auVar118._0_8_ =
                             *(ulong *)((long)local_688.data +
                                       (long)*(int *)(opt_q._0_8_ + uVar80 * 4) * 8 +
                                       local_688.cstep * local_688.elemsize * uVar84 +
                                       (long)(iVar102 * 8 * (int)uVar52) +
                                       (long)local_688.w * uVar81 * (long)iVar105 *
                                       local_688.elemsize);
                        auVar113 = vpcmpgtb_avx((undefined1  [16])0x0,auVar118);
                        auVar110 = vpunpcklbw_avx(auVar118,auVar113);
                        auVar126._8_8_ = 0;
                        auVar126._0_8_ = *(ulong *)((long)pvVar56 + uVar80 * 8);
                        auVar113 = vpcmpgtb_avx((undefined1  [16])0x0,auVar126);
                        auVar113 = vpunpcklbw_avx(auVar126,auVar113);
                        auVar121 = vpmullw_avx(auVar113,auVar110);
                        auVar113 = vpmulhw_avx(auVar110,auVar113);
                        auVar110 = vpunpcklwd_avx(auVar121,auVar113);
                        auVar113 = vpunpckhwd_avx(auVar121,auVar113);
                        auVar113 = vpaddd_avx(auVar110,auVar113);
                        auVar113 = vphaddd_avx(auVar113,auVar113);
                        auVar113 = vphaddd_avx(auVar113,auVar113);
                        iVar82 = iVar82 + auVar113._0_4_;
                      }
                      pvVar56 = (void *)((long)pvVar56 + (ulong)uVar98 * 8);
                    }
                    *(int *)((long)&local_700->data + uVar52 * 4) = iVar82;
                  }
                  local_700 = (Mat *)((long)&local_700->data + lVar69 * 4);
                }
              }
LAB_001faccd:
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        ((_Vector_base<int,_std::allocator<int>_> *)&opt_q);
            }
          }
        }
      }
      else if (iVar63 == 1 && local_638._0_4_ == 1) {
        p_Var3 = this->_vptr_Convolution_x86_fma[-3];
        uVar73 = *(uint *)(p_Var3 + 0x2c + (long)&(this->weight_winograd23_data).data);
        uVar44 = (ulong)uVar73;
        if ((uVar73 == 1) &&
           (*(int *)(p_Var3 + 0x30 + (long)&(this->weight_winograd23_data).data) == 1)) {
          if ((*(int *)(p_Var3 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1) &&
             (((*(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
               (*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
              (*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)))) {
            conv1x1s1_sgemm_int8_sse(&local_688,&local_618,&this->weight_sgemm_data,opt);
          }
          else {
            if ((((*(int *)(p_Var3 + 0x34 + (long)&(this->weight_winograd23_data).data) != 1) ||
                 (*(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data) != 1)) ||
                (*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) != 2)) ||
               (*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) != 2))
            goto LAB_001fa1f7;
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator._0_4_ = 0;
            opt_q.blob_allocator._4_4_ = 0;
            opt_q.workspace_allocator._0_4_ = 0;
            opt_q.workspace_allocator._4_4_ = 0;
            opt_q.openmp_blocktime = 0;
            opt_q._32_28_ = ZEXT1228((undefined1  [12])0x0);
            Mat::create((Mat *)&opt_q,local_618.w,local_618.h,local_688.c,local_688.elemsize,
                        local_688.elempack,opt->workspace_allocator);
            uVar44 = 0;
            if ((int)uVar74 < 1) {
              uVar74 = 0;
            }
            uVar64 = (ulong)(uint)iVar88;
            if (iVar88 < 1) {
              uVar64 = uVar44;
            }
            for (; uVar44 != uVar64; uVar44 = uVar44 + 1) {
              puVar53 = (undefined1 *)
                        (local_688.cstep * uVar44 * local_688.elemsize + (long)local_688.data);
              lVar69 = opt_q._0_8_;
              for (uVar73 = 0; uVar73 != uVar74; uVar73 = uVar73 + 1) {
                puVar79 = puVar53 + (iVar82 - iVar93) * 2;
                puVar89 = puVar53;
                for (lVar83 = 0; (int)lVar83 + 3 < iVar93; lVar83 = lVar83 + 4) {
                  *(undefined1 *)(lVar69 + lVar83) = *puVar89;
                  *(undefined1 *)(lVar69 + 1 + lVar83) = puVar89[2];
                  *(undefined1 *)(lVar69 + 2 + lVar83) = puVar89[4];
                  *(undefined1 *)(lVar69 + 3 + lVar83) = puVar89[6];
                  puVar89 = puVar89 + 8;
                  puVar79 = puVar79 + 8;
                }
                for (; (int)lVar83 + 1 < iVar93; lVar83 = lVar83 + 2) {
                  *(undefined1 *)(lVar69 + lVar83) = *puVar89;
                  *(undefined1 *)(lVar69 + 1 + lVar83) = puVar89[2];
                  puVar89 = puVar89 + 4;
                  puVar79 = puVar79 + 4;
                }
                for (; (int)lVar83 < iVar93; lVar83 = lVar83 + 1) {
                  *(undefined1 *)(lVar69 + lVar83) = puVar53[lVar83 * 2];
                  puVar79 = puVar79 + 2;
                }
                lVar69 = lVar69 + lVar83;
                puVar53 = puVar79;
              }
            }
            conv1x1s1_sgemm_int8_sse((Mat *)&opt_q,&local_618,&this->weight_sgemm_data,opt);
            piVar78 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
            if (piVar78 != (int *)0x0) {
              LOCK();
              *piVar78 = *piVar78 + -1;
              UNLOCK();
              if (*piVar78 == 0) {
                pvVar65 = (void *)opt_q._0_8_;
                if (opt_q._32_8_ == 0) goto LAB_001fe3a2;
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
          }
        }
        else {
LAB_001fa1f7:
          if (((((opt->use_winograd_convolution != true) || (uVar73 != 3)) ||
               ((opt->use_winograd23_convolution == false ||
                (((*(int *)(p_Var3 + 0x30 + (long)&(this->weight_winograd23_data).data) != 3 ||
                  (*(int *)(p_Var3 + 0x34 + (long)&(this->weight_winograd23_data).data) != 1)) ||
                 (*(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data) != 1)))))) ||
              ((*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1 ||
               (*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)))) ||
             ((iVar63 * local_620._0_4_ < 0x10 ||
              (*(int *)(p_Var3 + 0x28 + (long)&(this->weight_winograd23_data).data) < 0x10)))) {
            uVar87 = *(uint *)(p_Var3 + 0x30 + (long)&(this->weight_winograd23_data).data);
            iVar63 = *(int *)(p_Var3 + 0x34 + (long)&(this->weight_winograd23_data).data);
            iVar62 = *(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data);
            iVar102 = *(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data);
            lVar69 = (long)iVar102;
            iVar105 = *(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data);
            lVar83 = (long)local_618.w;
            uVar64 = (ulong)(uint)local_618.h;
            uVar98 = uVar87 * uVar73;
            uVar103 = (ulong)uVar98;
            if (opt->use_sgemm_convolution == true) {
              opt_q.lightmode = false;
              opt_q._1_3_ = 0;
              opt_q.num_threads = 0;
              opt_q.blob_allocator._0_4_ = 0;
              opt_q.blob_allocator._4_4_ = 0;
              opt_q.workspace_allocator._0_4_ = 0;
              opt_q.workspace_allocator._4_4_ = 0;
              opt_q.openmp_blocktime = 0;
              opt_q._32_28_ = ZEXT1228((undefined1  [12])0x0);
              Mat::create((Mat *)&opt_q,local_618.h * local_618.w,uVar98,local_688.c,1,1,
                          opt->workspace_allocator);
              lVar83 = (long)(iVar102 * 2);
              uVar64 = 0;
              if ((int)uVar74 < 1) {
                uVar74 = 0;
              }
              if ((int)uVar73 < 1) {
                uVar44 = uVar64;
              }
              uVar103 = (ulong)uVar87;
              if ((int)uVar87 < 1) {
                uVar103 = uVar64;
              }
              uVar106 = (ulong)(uint)iVar88;
              if (iVar88 < 1) {
                uVar106 = uVar64;
              }
              for (; uVar64 != uVar106; uVar64 = uVar64 + 1) {
                lVar51 = opt_q._0_8_;
                for (uVar81 = 0; uVar81 != uVar103; uVar81 = uVar81 + 1) {
                  for (uVar52 = 0; uVar52 != uVar44; uVar52 = uVar52 + 1) {
                    puVar53 = (undefined1 *)
                              ((long)local_688.data +
                              uVar52 * (long)iVar63 +
                              (long)local_688.w * local_688.elemsize * (long)iVar62 * uVar81 +
                              local_688.cstep * uVar64 * local_688.elemsize);
                    for (uVar73 = 0; uVar73 != uVar74; uVar73 = uVar73 + 1) {
                      lVar86 = 0;
                      puVar79 = puVar53;
                      for (lVar92 = 0; (int)lVar92 + 3 < iVar93; lVar92 = lVar92 + 4) {
                        *(undefined1 *)(lVar51 + lVar92) = *puVar79;
                        *(undefined1 *)(lVar51 + 1 + lVar92) = puVar79[lVar69];
                        *(undefined1 *)(lVar51 + 2 + lVar92) = puVar79[lVar83];
                        *(undefined1 *)(lVar51 + 3 + lVar92) = puVar79[iVar102 * 3];
                        puVar79 = puVar79 + iVar102 * 4;
                        lVar86 = lVar86 + iVar102 * 4;
                      }
                      for (; (int)lVar92 + 1 < iVar93; lVar92 = lVar92 + 2) {
                        *(undefined1 *)(lVar51 + lVar92) = *puVar79;
                        *(undefined1 *)(lVar51 + 1 + lVar92) = puVar79[lVar69];
                        puVar79 = puVar79 + lVar83;
                        lVar86 = lVar86 + lVar83;
                      }
                      for (; (int)lVar92 < iVar93; lVar92 = lVar92 + 1) {
                        *(undefined1 *)(lVar51 + lVar92) = puVar53[lVar86];
                        lVar86 = lVar86 + lVar69;
                      }
                      puVar53 = puVar53 + lVar86 + (iVar82 * iVar105 - iVar93 * iVar102);
                      lVar51 = lVar51 + lVar92;
                    }
                  }
                }
              }
              im2col_sgemm_int8_sse((Mat *)&opt_q,&local_618,&this->weight_sgemm_data,opt);
              piVar78 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
              if (piVar78 != (int *)0x0) {
                LOCK();
                *piVar78 = *piVar78 + -1;
                UNLOCK();
                if (*piVar78 == 0) {
                  pvVar65 = (void *)opt_q._0_8_;
                  if (opt_q._32_8_ == 0) goto LAB_001fe3a2;
                  (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                }
              }
              goto LAB_001facda;
            }
            uVar106 = (ulong)(uint)local_618.c;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar98,
                       (allocator_type *)&local_568);
            iVar102 = 0;
            if ((int)uVar73 < 1) {
              uVar44 = 0;
            }
            if ((int)uVar87 < 1) {
              uVar87 = 0;
            }
            uVar81 = uVar44;
            iVar68 = 0;
            for (uVar48 = 0; uVar48 != uVar87; uVar48 = uVar48 + 1) {
              for (lVar51 = (long)iVar68; (int)uVar81 != lVar51; lVar51 = lVar51 + 1) {
                *(int *)(opt_q._0_8_ + lVar51 * 4) = iVar102;
                iVar102 = iVar102 + iVar63;
              }
              iVar102 = iVar102 + (iVar82 * iVar62 - iVar63 * uVar73);
              uVar81 = (ulong)(uint)((int)uVar81 + (int)uVar44);
              iVar68 = iVar68 + (int)uVar44;
            }
            local_620 = (short  [4])(local_618.elemsize * local_618.cstep);
            local_638._0_4_ = iVar88 * uVar98;
            if ((int)uVar98 < 1) {
              uVar103 = 0;
            }
            uVar44 = (ulong)(uint)iVar88;
            if (iVar88 < 1) {
              uVar44 = 0;
            }
            uVar81 = 0;
            if (0 < iVar93) {
              uVar81 = (ulong)(uint)iVar93;
            }
            if ((int)uVar74 < 1) {
              uVar64 = 0;
            }
            local_640 = (short  [4])local_618.data;
            if (iVar97 < 1) {
              uVar106 = 0;
            }
            for (uVar52 = 0; uVar52 != uVar106; uVar52 = uVar52 + 1) {
              local_700 = (Mat *)((long)local_620 * uVar52 + (long)local_618.data);
              for (uVar84 = 0; uVar84 != uVar64; uVar84 = uVar84 + 1) {
                pvVar65 = (this->weight_data_tm).data;
                for (uVar80 = 0; uVar80 != uVar81; uVar80 = uVar80 + 1) {
                  iVar82 = 0;
                  lVar51 = (long)pvVar65 + (long)(int)(iVar88 * uVar98 * (int)uVar52);
                  for (uVar54 = 0; uVar54 != uVar44; uVar54 = uVar54 + 1) {
                    for (uVar90 = 0; uVar103 != uVar90; uVar90 = uVar90 + 1) {
                      iVar82 = iVar82 + (int)*(char *)(lVar51 + uVar90) *
                                        (int)*(char *)((long)local_688.data +
                                                      (long)*(int *)(opt_q._0_8_ + uVar90 * 4) +
                                                      local_688.cstep * local_688.elemsize * uVar54
                                                      + uVar80 * lVar69 +
                                                        (long)local_688.w * uVar84 * (long)iVar105 *
                                                        local_688.elemsize);
                    }
                    lVar51 = lVar51 + (int)uVar98;
                  }
                  *(int *)((long)&local_700->data + uVar80 * 4) = iVar82;
                }
                local_700 = (Mat *)((long)&local_700->data + lVar83 * 4);
              }
            }
            goto LAB_001faccd;
          }
          lVar69 = (long)local_688.c;
          uVar44 = (ulong)local_618.c;
          piVar78 = (int *)CONCAT44(local_688.refcount._4_4_,local_688.refcount._0_4_);
          opt_q._0_8_ = local_688.data;
          opt_q.blob_allocator._0_4_ = local_688.refcount._0_4_;
          opt_q.blob_allocator._4_4_ = local_688.refcount._4_4_;
          opt_q.workspace_allocator._0_4_ = (undefined4)local_688.elemsize;
          opt_q.workspace_allocator._4_4_ = (int)(local_688.elemsize >> 0x20);
          opt_q.openmp_blocktime = local_688.elempack;
          opt_q.use_subgroup_shuffle = (bool)(undefined1)local_688.w;
          opt_q.use_image_storage = (bool)local_688.w._1_1_;
          opt_q.use_tensor_storage = (bool)local_688.w._2_1_;
          opt_q.use_reserved_0 = (bool)local_688.w._3_1_;
          opt_q.use_shader_pack8 = (bool)(undefined1)local_688.dims;
          opt_q.use_subgroup_basic = (bool)local_688.dims._1_1_;
          opt_q.use_subgroup_vote = (bool)local_688.dims._2_1_;
          opt_q.use_subgroup_ballot = (bool)local_688.dims._3_1_;
          opt_q.use_local_pool_allocator = (bool)(undefined1)local_688.d;
          opt_q.use_shader_local_memory = (bool)local_688.d._1_1_;
          opt_q.use_cooperative_matrix = (bool)local_688.d._2_1_;
          opt_q.use_winograd23_convolution = (bool)local_688.d._3_1_;
          opt_q.flush_denormals = local_688.h;
          opt_q._32_8_ = local_688.allocator;
          opt_q.use_winograd43_convolution = (bool)(undefined1)local_688.c;
          opt_q.use_winograd63_convolution = (bool)local_688.c._1_1_;
          opt_q.use_a53_a55_optimized_kernel = (bool)local_688.c._2_1_;
          opt_q.use_reserved_7 = (bool)local_688.c._3_1_;
          if (piVar78 != (int *)0x0) {
            LOCK();
            *piVar78 = *piVar78 + 1;
            UNLOCK();
          }
          uVar64 = (long)(int)(local_618.w + 1) / 2;
          local_400 = uVar64 & 0xffffffff;
          uVar103 = (long)(int)(local_618.h + 1) / 2;
          iVar82 = (int)uVar103;
          local_3e0 = iVar82 * 2;
          iVar63 = (int)uVar64 * 2 + 2;
          opt_b.lightmode = opt->lightmode;
          opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
          opt_b.num_threads = opt->num_threads;
          opt_b.workspace_allocator = opt->workspace_allocator;
          uVar13 = opt->openmp_blocktime;
          uVar14 = opt->use_winograd_convolution;
          uVar16 = opt->use_sgemm_convolution;
          uVar18 = opt->use_int8_inference;
          uVar20 = opt->use_vulkan_compute;
          uVar19 = CONCAT11(uVar20,uVar18);
          uVar17 = CONCAT21(uVar19,uVar16);
          uVar15 = CONCAT31(uVar17,uVar14);
          opt_b.use_bf16_storage = opt->use_bf16_storage;
          opt_b.use_fp16_packed = opt->use_fp16_packed;
          opt_b.use_fp16_storage = opt->use_fp16_storage;
          opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
          opt_b.use_int8_packed = opt->use_int8_packed;
          opt_b.use_int8_storage = opt->use_int8_storage;
          opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
          opt_b.use_packing_layout = opt->use_packing_layout;
          uVar41._0_1_ = opt->use_shader_pack8;
          uVar41._1_1_ = opt->use_subgroup_basic;
          uVar41._2_1_ = opt->use_subgroup_vote;
          uVar41._3_1_ = opt->use_subgroup_ballot;
          uVar21 = opt->use_subgroup_shuffle;
          uVar22 = opt->use_image_storage;
          uVar24 = opt->use_tensor_storage;
          uVar26 = opt->use_reserved_0;
          uVar25 = CONCAT11(uVar26,uVar24);
          uVar23 = CONCAT21(uVar25,uVar22);
          uVar41._4_4_ = CONCAT31(uVar23,uVar21);
          uVar27 = opt->flush_denormals;
          uVar28 = opt->use_local_pool_allocator;
          uVar30 = opt->use_shader_local_memory;
          uVar32 = opt->use_cooperative_matrix;
          uVar34 = opt->use_winograd23_convolution;
          uVar33 = CONCAT11(uVar34,uVar32);
          uVar31 = CONCAT21(uVar33,uVar30);
          uVar29 = CONCAT31(uVar31,uVar28);
          uVar42._0_1_ = opt->use_winograd43_convolution;
          uVar42._1_1_ = opt->use_winograd63_convolution;
          uVar42._2_1_ = opt->use_a53_a55_optimized_kernel;
          uVar42._3_1_ = opt->use_reserved_7;
          uVar35 = opt->use_reserved_8;
          uVar36 = opt->use_reserved_9;
          uVar38 = opt->use_reserved_10;
          uVar40 = opt->use_reserved_11;
          uVar39 = CONCAT11(uVar40,uVar38);
          uVar37 = CONCAT21(uVar39,uVar36);
          uVar42._4_4_ = CONCAT31(uVar37,uVar35);
          opt_b._40_4_ = SUB84(uVar41,0);
          opt_b._56_4_ = SUB84(uVar42,0);
          opt_b.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
          opt_b.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
          opt_b.openmp_blocktime = uVar13;
          opt_b._28_4_ = uVar15;
          opt_b._44_4_ = uVar41._4_4_;
          opt_b.flush_denormals = uVar27;
          opt_b._52_4_ = uVar29;
          opt_b._60_4_ = uVar42._4_4_;
          copy_make_border(&local_688,(Mat *)&opt_q,0,(local_3e0 - local_688.h) + 2,0,
                           iVar63 - local_688.w,0,0.0,&opt_b);
          local_568.cstep = 0;
          asVar46._0_4_ = iVar82 * (int)local_400;
          asVar46[2] = 0;
          asVar46[3] = 0;
          local_568.data = (void *)0x0;
          local_568.refcount._0_4_ = 0;
          local_568.refcount._4_4_ = 0;
          local_568.elemsize = 0;
          local_568.elempack = 0;
          local_568.allocator = (Allocator *)0x0;
          local_568.dims = 0;
          local_568.w = 0;
          local_568.h = 0;
          local_568.d = 0;
          local_568.c = 0;
          Mat::create(&local_568,0x10,asVar46._0_4_,iVar88,2,opt->workspace_allocator);
          uVar41 = opt_q._0_8_;
          pvVar65 = local_568.data;
          uVar74 = (uint)local_400;
          local_3e4 = uVar74 * 2;
          lVar83 = CONCAT44(opt_q.workspace_allocator._4_4_,opt_q.workspace_allocator._0_4_);
          lVar51 = local_568.elemsize * local_568.cstep;
          lVar92 = (long)iVar63;
          uVar64 = 0;
          uVar73 = 0;
          if (0 < (int)uVar74) {
            uVar73 = uVar74;
          }
          uVar103 = uVar103 & 0xffffffff;
          if (iVar82 < 1) {
            uVar103 = uVar64;
          }
          uVar106 = 0;
          if (0 < iVar88) {
            uVar106 = (ulong)(uint)iVar88;
          }
          for (; uVar64 != uVar106; uVar64 = uVar64 + 1) {
            pvVar56 = (void *)(lVar51 * uVar64 + (long)pvVar65);
            for (uVar81 = 0; uVar81 != uVar103; uVar81 = uVar81 + 1) {
              lVar72 = (long)(iVar63 * 2 * (int)uVar81) + lVar83 * sVar60 * uVar64 + uVar41;
              lVar86 = lVar72 + lVar92;
              lVar101 = lVar92 + lVar86;
              lVar66 = lVar101 + lVar92;
              for (uVar74 = 0; uVar74 != uVar73; uVar74 = uVar74 + 1) {
                for (lVar109 = 0; lVar109 != 4; lVar109 = lVar109 + 1) {
                  d0[lVar109] = (short)*(char *)(lVar72 + lVar109);
                  d1[lVar109] = (short)*(char *)(lVar86 + lVar109);
                  d2[lVar109] = (short)*(char *)(lVar101 + lVar109);
                  d3[lVar109] = (short)*(char *)(lVar66 + lVar109);
                }
                for (lVar109 = 0; lVar109 != 8; lVar109 = lVar109 + 2) {
                  sVar1 = *(short *)((long)d2 + lVar109);
                  *(short *)((long)w0 + lVar109) = *(short *)((long)d0 + lVar109) - sVar1;
                  sVar2 = *(short *)((long)d1 + lVar109);
                  *(short *)((long)w1 + lVar109) = sVar2 + sVar1;
                  *(short *)((long)w2 + lVar109) = sVar1 - sVar2;
                  *(short *)((long)w3 + lVar109) = *(short *)((long)d3 + lVar109) - sVar2;
                }
                t0[1] = w1[0];
                t0[0] = w0[0];
                t1[1] = w1[1];
                t1[0] = w0[1];
                t2[1] = w1[2];
                t2[0] = w0[2];
                t3[1] = w1[3];
                t3[0] = w0[3];
                t0[2] = (short)w2._0_4_;
                t0[3] = w3[0];
                t1[3] = w3[1];
                t1[2] = w2[1];
                t2[2] = (short)w2._4_4_;
                t2[3] = w3[2];
                t3[3] = w3[3];
                t3[2] = w2[3];
                for (lVar109 = 0; lVar109 != 8; lVar109 = lVar109 + 2) {
                  sVar1 = *(short *)((long)t2 + lVar109);
                  *(short *)((long)d0 + lVar109) = *(short *)((long)t0 + lVar109) - sVar1;
                  sVar2 = *(short *)((long)t1 + lVar109);
                  *(short *)((long)d1 + lVar109) = sVar2 + sVar1;
                  *(short *)((long)d2 + lVar109) = sVar1 - sVar2;
                  *(short *)((long)d3 + lVar109) = *(short *)((long)t3 + lVar109) - sVar2;
                }
                for (lVar109 = 0; lVar109 != 8; lVar109 = lVar109 + 2) {
                  *(undefined2 *)((long)pvVar56 + lVar109) = *(undefined2 *)((long)d0 + lVar109);
                  *(undefined2 *)((long)pvVar56 + lVar109 + 8) = *(undefined2 *)((long)d1 + lVar109)
                  ;
                  *(undefined2 *)((long)pvVar56 + lVar109 + 0x10) =
                       *(undefined2 *)((long)d2 + lVar109);
                  *(undefined2 *)((long)pvVar56 + lVar109 + 0x18) =
                       *(undefined2 *)((long)d3 + lVar109);
                }
                lVar72 = lVar72 + 2;
                lVar86 = lVar86 + 2;
                lVar101 = lVar101 + 2;
                lVar66 = lVar66 + 2;
                pvVar56 = (void *)((long)pvVar56 + 0x20);
              }
            }
          }
          piVar78 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
          if (piVar78 != (int *)0x0) {
            LOCK();
            *piVar78 = *piVar78 + -1;
            UNLOCK();
            if (*piVar78 == 0) {
              if (opt_q._32_8_ == 0) {
                free((void *)opt_q._0_8_);
              }
              else {
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
          }
          opt_q.lightmode = false;
          opt_q._1_3_ = 0;
          opt_q.num_threads = 0;
          opt_q.blob_allocator._0_4_ = 0;
          opt_q.blob_allocator._4_4_ = 0;
          opt_q.workspace_allocator._0_4_ = 0;
          opt_q.workspace_allocator._4_4_ = 0;
          opt_q.openmp_blocktime = 0;
          opt_q._32_28_ = ZEXT1228((undefined1  [12])opt_q._32_12_);
          opt_q._32_32_ = ZEXT1632((undefined1  [16])opt_q._48_16_) << 0x80;
          d0[0] = 0;
          d0[1] = 0;
          d0[2] = 0;
          d0[3] = 0;
          Mat::create((Mat *)d0,0x10,asVar46._0_4_,iVar97,4,opt->workspace_allocator);
          asVar71._0_4_ = iVar97 >> 2;
          local_168 = 0;
          local_170 = (this->weight_winograd23_data).elemsize;
          lVar83 = (this->weight_winograd23_data).cstep * local_170;
          asVar77[0] = 0;
          asVar77[1] = 0;
          asVar77[2] = 0;
          asVar77[3] = 0;
          if ((int)asVar46._0_4_ < 1) {
            asVar46 = asVar77;
          }
          local_4e8 = (this->weight_winograd23_data).data;
          asVar71[2] = 0;
          asVar71[3] = 0;
          if ((int)asVar71._0_4_ < 1) {
            asVar71 = asVar77;
          }
          local_160[0] = asVar71[0];
          local_160[1] = asVar71[1];
          local_160[2] = asVar71[2];
          local_160[3] = asVar71[3];
          local_178 = lVar83 * 4;
          local_180 = local_170 * 4;
          local_628 = (void *)(lVar83 * 3 + (long)local_4e8);
          local_5c8 = (void *)((long)local_4e8 + lVar83 * 2);
          local_188 = 0;
          local_408[0] = d0[0];
          local_408[1] = d0[1];
          local_408[2] = d0[2];
          local_408[3] = d0[3];
          local_518[0] = d0[0];
          local_518[1] = d0[1];
          local_518[2] = d0[2];
          local_518[3] = d0[3];
          local_438 = (void *)((long)local_4e8 + lVar83);
          for (; asVar77 != asVar71; asVar77 = (short  [4])((long)asVar77 + 1)) {
            lVar51 = (long)(this->weight_winograd23_data).w;
            local_510 = 0;
            lVar92 = local_170 * lVar51;
            lVar51 = lVar51 * local_170 * 4;
            local_3f8[0] = d0[0];
            local_3f8[1] = d0[1];
            local_3f8[2] = d0[2];
            local_3f8[3] = d0[3];
            asVar108[0] = 0;
            asVar108[1] = 0;
            asVar108[2] = 0;
            asVar108[3] = 0;
            while (asVar70 = asVar108, asVar70 != asVar46) {
              d1[0] = 0;
              d1[1] = 0;
              d1[2] = 0;
              d1[3] = 0;
              d2[0] = 0;
              d2[1] = 0;
              d2[2] = 0;
              d2[3] = 0;
              d3[0] = 0;
              d3[1] = 0;
              d3[2] = 0;
              d3[3] = 0;
              w0[0] = 0;
              w0[1] = 0;
              w0[2] = 0;
              w0[3] = 0;
              local_630 = (short  [4])(local_568.elemsize * local_568.cstep);
              lVar101 = (long)local_568.w * (long)asVar70;
              pvVar91 = (void *)((local_568.cstep * 3 + lVar101) * local_568.elemsize +
                                (long)local_568.data);
              lVar86 = (long)local_630 * 4;
              pvVar94 = (void *)((lVar101 + local_568.cstep * 2) * local_568.elemsize +
                                (long)local_568.data);
              pvVar107 = (void *)((local_568.cstep + lVar101) * local_568.elemsize +
                                 (long)local_568.data);
              pvVar85 = (void *)(lVar101 * local_568.elemsize + (long)local_568.data);
              local_6e8 = local_5c8;
              pvVar65 = local_438;
              pvVar56 = local_628;
              pvVar100 = local_4e8;
              for (uVar64 = 0; (long)(uVar64 | 3) < lVar69; uVar64 = uVar64 + 4) {
                for (lVar101 = 0; lVar101 != 0x20; lVar101 = lVar101 + 2) {
                  iVar93 = (int)*(short *)((long)pvVar85 + lVar101);
                  iVar82 = (int)*(short *)((long)pvVar107 + lVar101);
                  iVar63 = (int)*(short *)((long)pvVar94 + lVar101);
                  iVar88 = (int)*(short *)((long)pvVar91 + lVar101);
                  *(int *)(d1 + lVar101) =
                       *(short *)((long)pvVar100 + lVar101 + 0x60) * iVar88 +
                       *(short *)((long)pvVar100 + lVar101 + 0x40) * iVar63 +
                       *(short *)((long)pvVar100 + lVar101 + 0x20) * iVar82 +
                       *(short *)((long)pvVar100 + lVar101) * iVar93 + *(int *)(d1 + lVar101);
                  lVar66 = lVar83 + lVar101;
                  *(int *)(d2 + lVar101) =
                       *(short *)((long)pvVar100 + lVar83 + 0x60 + lVar101) * iVar88 +
                       *(short *)((long)pvVar100 + lVar83 + 0x40 + lVar101) * iVar63 +
                       *(short *)((long)pvVar100 + lVar83 + 0x20 + lVar101) * iVar82 +
                       *(short *)((long)pvVar100 + lVar83 + lVar101) * iVar93 +
                       *(int *)(d2 + lVar101);
                  lVar72 = lVar83 + lVar66;
                  *(int *)(d3 + lVar101) =
                       *(short *)((long)pvVar100 + lVar83 + 0x60 + lVar66) * iVar88 +
                       *(short *)((long)pvVar100 + lVar83 + 0x40 + lVar66) * iVar63 +
                       *(short *)((long)pvVar100 + lVar83 + 0x20 + lVar66) * iVar82 +
                       *(short *)((long)pvVar100 + lVar83 + lVar66) * iVar93 +
                       *(int *)(d3 + lVar101);
                  *(int *)(w0 + lVar101) =
                       *(short *)((long)pvVar100 + lVar83 + 0x60 + lVar72) * iVar88 +
                       *(short *)((long)pvVar100 + lVar83 + 0x40 + lVar72) * iVar63 +
                       *(short *)((long)pvVar100 + lVar83 + 0x20 + lVar72) * iVar82 +
                       *(short *)((long)pvVar100 + lVar83 + lVar72) * iVar93 +
                       *(int *)(w0 + lVar101);
                }
                pvVar91 = (void *)((long)pvVar91 + lVar86);
                pvVar94 = (void *)((long)pvVar94 + lVar86);
                pvVar107 = (void *)((long)pvVar107 + lVar86);
                pvVar100 = (void *)((long)pvVar100 + lVar51);
                pvVar85 = (void *)((long)pvVar85 + lVar86);
                pvVar56 = (void *)((long)pvVar56 + lVar51);
                local_6e8 = (void *)((long)local_6e8 + lVar51);
                pvVar65 = (void *)((long)pvVar65 + lVar51);
              }
              for (; (long)uVar64 < lVar69; uVar64 = uVar64 + 1) {
                for (lVar86 = 0; lVar86 != 0x20; lVar86 = lVar86 + 2) {
                  iVar82 = (int)*(short *)((long)pvVar85 + lVar86);
                  *(int *)(d1 + lVar86) =
                       *(int *)(d1 + lVar86) + *(short *)((long)pvVar100 + lVar86) * iVar82;
                  *(int *)(d2 + lVar86) =
                       *(int *)(d2 + lVar86) + *(short *)((long)pvVar65 + lVar86) * iVar82;
                  *(int *)(d3 + lVar86) =
                       *(int *)(d3 + lVar86) + *(short *)((long)local_6e8 + lVar86) * iVar82;
                  *(int *)(w0 + lVar86) =
                       *(int *)(w0 + lVar86) + *(short *)((long)pvVar56 + lVar86) * iVar82;
                }
                pvVar56 = (void *)((long)pvVar56 + lVar92);
                local_6e8 = (void *)((long)local_6e8 + lVar92);
                pvVar65 = (void *)((long)pvVar65 + lVar92);
                pvVar100 = (void *)((long)pvVar100 + lVar92);
                pvVar85 = (void *)((long)pvVar85 + (long)local_630);
              }
              for (lVar86 = 0; lVar86 != 0x40; lVar86 = lVar86 + 4) {
                *(undefined4 *)((long)d0 + lVar86) = *(undefined4 *)((long)d1 + lVar86);
                *(undefined4 *)((long)local_518 + lVar86) = *(undefined4 *)((long)d2 + lVar86);
                *(undefined4 *)((long)local_408 + lVar86) = *(undefined4 *)((long)d3 + lVar86);
                *(undefined4 *)((long)d0 + lVar86) = *(undefined4 *)((long)w0 + lVar86);
              }
              local_640 = asVar70;
              local_638 = d0;
              local_620 = local_408;
              asVar108 = (short  [4])((long)asVar70 + 1);
            }
            local_4e8 = (void *)((long)local_4e8 + local_178);
            local_628 = (void *)((long)local_628 + local_178);
            local_5c8 = (void *)((long)local_5c8 + local_178);
            local_438 = (void *)((long)local_438 + local_178);
          }
          uVar64 = uVar44 & 0xfffffffffffffffc;
          local_5c8 = (void *)(this->weight_winograd23_data).elemsize;
          lVar83 = (this->weight_winograd23_data).cstep * (long)local_5c8;
          local_6e0 = (void *)(lVar83 * uVar64 + (long)(this->weight_winograd23_data).data);
          local_5c0 = (long)local_5c8 * 3;
          local_510 = (long)local_5c8 * 4;
          local_628 = (void *)0x0;
          local_5d0 = (int *)0x0;
          for (; (long)uVar64 < (long)uVar44; uVar64 = uVar64 + 1) {
            lVar51 = (long)(this->weight_winograd23_data).w;
            local_638 = (short  [4])((long)local_5c8 * lVar51);
            local_640 = (short  [4])(local_5c0 * lVar51 + (long)local_6e0);
            lVar92 = (long)local_5c8 * 4 * lVar51;
            local_620 = (short  [4])(lVar51 * (long)local_5c8 * 2 + (long)local_6e0);
            local_630 = (short  [4])((long)local_6e0 + (long)local_638);
            asVar70[0] = 0;
            asVar70[1] = 0;
            asVar70[2] = 0;
            asVar70[3] = 0;
            for (; asVar70 != asVar46; asVar70 = (short  [4])((long)asVar70 + 1)) {
              d1[0] = 0;
              d1[1] = 0;
              d1[2] = 0;
              d1[3] = 0;
              lVar86 = (long)local_568.w * (long)asVar70;
              pvVar85 = (void *)((local_568.cstep * 3 + lVar86) * local_568.elemsize +
                                (long)local_568.data);
              lVar51 = local_568.elemsize * local_568.cstep * 4;
              pvVar56 = (void *)((lVar86 + local_568.cstep * 2) * local_568.elemsize +
                                (long)local_568.data);
              pvVar91 = (void *)((local_568.cstep + lVar86) * local_568.elemsize +
                                (long)local_568.data);
              pvVar100 = (void *)(lVar86 * local_568.elemsize + (long)local_568.data);
              pvVar65 = local_6e0;
              asVar71 = local_630;
              asVar77 = local_640;
              asVar108 = local_620;
              for (uVar106 = 0; (long)(uVar106 | 3) < lVar69; uVar106 = uVar106 + 4) {
                for (lVar86 = 0; lVar86 != 0x20; lVar86 = lVar86 + 2) {
                  *(int *)(d1 + lVar86) =
                       (int)*(short *)((long)asVar77 + lVar86) *
                       (int)*(short *)((long)pvVar85 + lVar86) +
                       (int)*(short *)((long)asVar108 + lVar86) *
                       (int)*(short *)((long)pvVar56 + lVar86) +
                       (int)*(short *)((long)asVar71 + lVar86) *
                       (int)*(short *)((long)pvVar91 + lVar86) +
                       (int)*(short *)((long)pvVar65 + lVar86) *
                       (int)*(short *)((long)pvVar100 + lVar86) + *(int *)(d1 + lVar86);
                }
                asVar77 = (short  [4])((long)asVar77 + lVar92);
                pvVar85 = (void *)((long)pvVar85 + lVar51);
                asVar108 = (short  [4])((long)asVar108 + lVar92);
                pvVar56 = (void *)((long)pvVar56 + lVar51);
                asVar71 = (short  [4])((long)asVar71 + lVar92);
                pvVar91 = (void *)((long)pvVar91 + lVar51);
                pvVar65 = (void *)((long)pvVar65 + lVar92);
                pvVar100 = (void *)((long)pvVar100 + lVar51);
              }
              for (; (long)uVar106 < lVar69; uVar106 = uVar106 + 1) {
                for (lVar51 = 0; lVar51 != 0x10; lVar51 = lVar51 + 1) {
                  *(int *)(d1 + lVar51 * 2) =
                       *(int *)(d1 + lVar51 * 2) +
                       (int)*(short *)((long)pvVar65 + lVar51 * 2) *
                       (int)*(short *)((long)pvVar100 + lVar51 * 2);
                }
                pvVar65 = (void *)((long)pvVar65 + (long)local_638);
                pvVar100 = (void *)((long)pvVar100 + local_568.elemsize * local_568.cstep);
              }
              for (lVar51 = 0; lVar51 != 0x10; lVar51 = lVar51 + 1) {
                *(undefined4 *)((long)d0 + lVar51 * 4) = *(undefined4 *)(d1 + lVar51 * 2);
              }
            }
            local_6e0 = (void *)((long)local_6e0 + lVar83);
          }
          piVar78 = (int *)CONCAT44(local_568.refcount._4_4_,local_568.refcount._0_4_);
          if (piVar78 != (int *)0x0) {
            LOCK();
            *piVar78 = *piVar78 + -1;
            UNLOCK();
            if (*piVar78 == 0) {
              if (local_568.allocator == (Allocator *)0x0) {
                free(local_568.data);
              }
              else {
                (*(local_568.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_568.cstep = 0;
          local_568.data = (void *)0x0;
          local_568.refcount._0_4_ = 0;
          local_568.refcount._4_4_ = 0;
          local_568.elemsize = 0;
          local_568.elempack = 0;
          local_568.h = 0;
          local_568.d = 0;
          local_568.c = 0;
          local_568.allocator = (Allocator *)0x0;
          local_568.dims = 0;
          local_568.w = 0;
          d1[0] = 0;
          d1[1] = 0;
          d1[2] = 0;
          d1[3] = 0;
          Mat::create((Mat *)d1,local_3e4,local_3e0,iVar97,4,opt->workspace_allocator);
          uVar64 = 0;
          uVar44 = (ulong)(uint)iVar97;
          if (iVar97 < 1) {
            uVar44 = uVar64;
          }
          for (; uVar64 != uVar44; uVar64 = uVar64 + 1) {
            for (uVar106 = 0; uVar106 != uVar103; uVar106 = uVar106 + 1) {
              asVar46 = d1;
              asVar71 = d1;
              for (uVar81 = 0; uVar81 != uVar73; uVar81 = uVar81 + 1) {
                for (lVar69 = 0; lVar69 != 0x10; lVar69 = lVar69 + 4) {
                  *(undefined4 *)((long)d2 + lVar69) = *(undefined4 *)((long)d0 + lVar69);
                  *(undefined4 *)((long)d3 + lVar69) = *(undefined4 *)((long)d0 + 0x10 + lVar69);
                  *(undefined4 *)((long)w0 + lVar69) = *(undefined4 *)((long)d0 + 0x20 + lVar69);
                  *(undefined4 *)((long)w1 + lVar69) = *(undefined4 *)((long)d0 + 0x30 + lVar69);
                }
                for (lVar69 = 0; lVar69 != 0x10; lVar69 = lVar69 + 4) {
                  *(int *)((long)w2 + lVar69) =
                       *(int *)((long)d2 + lVar69) + *(int *)((long)d3 + lVar69) +
                       *(int *)((long)w0 + lVar69);
                  *(int *)((long)w3 + lVar69) =
                       (*(int *)((long)d3 + lVar69) - *(int *)((long)w0 + lVar69)) +
                       *(int *)((long)w1 + lVar69);
                }
                t0[0] = w2[0];
                t0[1] = w2[1];
                t0[2] = w3[0];
                t0[3] = w3[1];
                t1[0] = w2[2];
                t1[1] = w2[3];
                t1[2] = w3[2];
                t1[3] = w3[3];
                t2._0_4_ = local_410;
                t2._4_4_ = local_420;
                t3._0_4_ = local_40c;
                t3._4_4_ = local_41c;
                for (lVar69 = 0; lVar69 != 8; lVar69 = lVar69 + 4) {
                  *(int *)((long)o0 + lVar69) =
                       *(int *)((long)t0 + lVar69) + *(int *)((long)t1 + lVar69) +
                       *(int *)((long)t2 + lVar69);
                  *(int *)((long)o0 + lVar69 + -8) =
                       (*(int *)((long)t1 + lVar69) - *(int *)((long)t2 + lVar69)) +
                       *(int *)((long)t3 + lVar69);
                }
                auVar115._8_8_ = 0;
                auVar115._0_4_ = o0[0];
                auVar115._4_4_ = o0[1];
                auVar113 = vpsrad_avx(auVar115,2);
                *(long *)asVar46 = auVar113._0_8_;
                auVar116._8_8_ = 0;
                auVar116._0_8_ = local_158;
                auVar113 = vpsrad_avx(auVar116,2);
                *(long *)asVar71 = auVar113._0_8_;
                asVar46 = (short  [4])((long)asVar46 + 8);
                asVar71 = (short  [4])((long)asVar71 + 8);
              }
            }
          }
          copy_cut_border((Mat *)d1,&local_618,0,-local_618.h,0,-local_618.w,opt);
          piVar78 = (int *)CONCAT44(local_568.refcount._4_4_,local_568.refcount._0_4_);
          if (piVar78 != (int *)0x0) {
            LOCK();
            *piVar78 = *piVar78 + -1;
            UNLOCK();
            if (*piVar78 == 0) {
              if (local_568.allocator == (Allocator *)0x0) {
                free(local_568.data);
              }
              else {
                (*(local_568.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          piVar78 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
          if (piVar78 != (int *)0x0) {
            LOCK();
            *piVar78 = *piVar78 + -1;
            UNLOCK();
            if (*piVar78 == 0) {
              pvVar65 = (void *)opt_q._0_8_;
              if (opt_q._32_8_ == 0) goto LAB_001fe3a2;
              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            }
          }
        }
      }
    }
    else {
LAB_001f84b0:
      if (((opt->use_winograd_convolution != true) || (uVar98 != 3)) ||
         ((opt->use_winograd43_convolution == false ||
          ((((*(int *)(p_Var3 + 0x30 + (long)&(this->weight_winograd23_data).data) != 3 ||
             (*(int *)(p_Var3 + 0x34 + (long)&(this->weight_winograd23_data).data) != 1)) ||
            (*(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data) != 1)) ||
           ((*(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1 ||
            (*(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)))))))) {
        uVar48 = *(uint *)(p_Var3 + 0x30 + (long)&(this->weight_winograd23_data).data);
        uVar64 = (ulong)uVar48;
        iVar82 = *(int *)(p_Var3 + 0x34 + (long)&(this->weight_winograd23_data).data);
        iVar97 = *(int *)(p_Var3 + 0x38 + (long)&(this->weight_winograd23_data).data);
        iVar62 = *(int *)(p_Var3 + 0x3c + (long)&(this->weight_winograd23_data).data);
        iVar102 = *(int *)(p_Var3 + 0x40 + (long)&(this->weight_winograd23_data).data);
        local_6b8._0_4_ = local_688.w;
        lVar69 = (long)local_618.w;
        if (opt->use_sgemm_convolution == true) {
          opt_q.lightmode = false;
          opt_q._1_3_ = 0;
          opt_q.num_threads = 0;
          opt_q.blob_allocator._0_4_ = 0;
          opt_q.blob_allocator._4_4_ = 0;
          opt_q.workspace_allocator._0_4_ = 0;
          opt_q.workspace_allocator._4_4_ = 0;
          opt_q.openmp_blocktime = 0;
          opt_q._32_28_ = ZEXT1228((undefined1  [12])0x0);
          Mat::create((Mat *)&opt_q,local_618.h * local_618.w,uVar48 * uVar98,local_688.c,8,8,
                      opt->workspace_allocator);
          iVar93 = iVar62 * uVar73;
          if ((int)uVar73 < 1) {
            uVar73 = 0;
          }
          if ((int)uVar87 < 1) {
            uVar87 = 0;
          }
          if ((int)uVar98 < 1) {
            uVar44 = 0;
          }
          if ((int)uVar48 < 1) {
            uVar64 = 0;
          }
          if ((int)uVar74 < 1) {
            uVar74 = 0;
          }
          for (uVar103 = 0; uVar103 != uVar74; uVar103 = uVar103 + 1) {
            pvVar65 = (void *)(local_688.cstep * uVar103 * local_688.elemsize + (long)local_688.data
                              );
            local_6b8 = (Mat *)pvVar65;
            puVar76 = (undefined8 *)opt_q._0_8_;
            for (uVar106 = 0; uVar106 != uVar64; uVar106 = uVar106 + 1) {
              for (uVar81 = 0; uVar81 != uVar44; uVar81 = uVar81 + 1) {
                puVar75 = (undefined8 *)
                          ((long)pvVar65 +
                          uVar81 * (long)iVar82 * 8 +
                          local_688.elemsize * (long)local_688.w * (long)iVar97 * uVar106);
                for (uVar98 = 0; uVar48 = uVar73, uVar98 != uVar87; uVar98 = uVar98 + 1) {
                  while (uVar48 != 0) {
                    *puVar76 = *puVar75;
                    puVar76 = puVar76 + 1;
                    puVar75 = puVar75 + iVar62;
                    uVar48 = uVar48 - 1;
                  }
                  puVar75 = puVar75 + ((long)(iVar88 * iVar102) - (long)iVar93);
                }
              }
            }
          }
          im2col_sgemm_pack8to4_int8_sse((Mat *)&opt_q,&local_618,&this->weight_sgemm_data,opt);
          piVar78 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
          if (piVar78 != (int *)0x0) {
            LOCK();
            *piVar78 = *piVar78 + -1;
            UNLOCK();
            if (*piVar78 == 0) {
              if (opt_q._32_8_ == 0) goto LAB_001fae98;
              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            }
          }
        }
        else {
          uVar104 = uVar48 * uVar98;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar104,
                     (allocator_type *)&local_568);
          local_6b8._0_4_ = iVar88 * iVar97 - iVar82 * uVar98;
          uVar47 = 0;
          if ((int)uVar98 < 1) {
            uVar44 = 0;
          }
          if ((int)uVar48 < 1) {
            uVar48 = 0;
          }
          iVar97 = 0;
          uVar64 = uVar44;
          iVar88 = 0;
          for (; uVar47 != uVar48; uVar47 = uVar47 + 1) {
            for (lVar83 = (long)iVar88; (int)uVar64 != lVar83; lVar83 = lVar83 + 1) {
              *(int *)(opt_q._0_8_ + lVar83 * 4) = iVar97;
              iVar97 = iVar97 + iVar82;
            }
            iVar97 = iVar97 + (int)local_6b8;
            uVar64 = (ulong)(uint)((int)uVar64 + (int)uVar44);
            iVar88 = iVar88 + (int)uVar44;
          }
          uVar64 = 0;
          uVar44 = (ulong)uVar104;
          if ((int)uVar104 < 1) {
            uVar44 = uVar64;
          }
          uVar103 = (ulong)uVar74;
          if ((int)uVar74 < 1) {
            uVar103 = uVar64;
          }
          uVar106 = 0;
          if (0 < (int)uVar73) {
            uVar106 = (ulong)uVar73;
          }
          uVar81 = (ulong)uVar87;
          if ((int)uVar87 < 1) {
            uVar81 = uVar64;
          }
          uVar52 = (ulong)(uint)iVar93;
          if (iVar93 < 1) {
            uVar52 = uVar64;
          }
          for (; uVar64 != uVar52; uVar64 = uVar64 + 1) {
            local_6b8 = (Mat *)(local_618.cstep * uVar64 * local_618.elemsize + (long)local_618.data
                               );
            for (uVar84 = 0; uVar84 != uVar81; uVar84 = uVar84 + 1) {
              for (uVar80 = 0; uVar80 != uVar106; uVar80 = uVar80 + 1) {
                pvVar65 = (void *)((this->weight_data_tm).cstep * uVar64 *
                                   (this->weight_data_tm).elemsize +
                                  (long)(this->weight_data_tm).data);
                auVar124 = ZEXT1664((undefined1  [16])0x0);
                auVar125 = ZEXT1664((undefined1  [16])0x0);
                auVar127 = ZEXT1664((undefined1  [16])0x0);
                auVar129 = ZEXT1664((undefined1  [16])0x0);
                for (uVar54 = 0; uVar54 != uVar103; uVar54 = uVar54 + 1) {
                  for (lVar83 = 0; uVar44 * 4 != lVar83; lVar83 = lVar83 + 4) {
                    auVar121._8_8_ = 0;
                    auVar121._0_8_ =
                         *(ulong *)((long)local_688.data +
                                   (long)*(int *)(opt_q._0_8_ + lVar83) * 8 +
                                   local_688.cstep * local_688.elemsize * uVar54 +
                                   (long)(iVar62 * 8 * (int)uVar80) +
                                   (long)local_688.w * uVar84 * (long)iVar102 * local_688.elemsize);
                    auVar113 = vpcmpgtb_avx((undefined1  [16])0x0,auVar121);
                    auVar133 = vpunpcklbw_avx(auVar121,auVar113);
                    auVar113 = *(undefined1 (*) [16])((long)pvVar65 + lVar83 * 8);
                    auVar121 = *(undefined1 (*) [16])((long)pvVar65 + lVar83 * 8 + 0x10);
                    auVar110 = vpcmpgtb_avx((undefined1  [16])0x0,auVar113);
                    auVar136 = vpcmpgtb_avx((undefined1  [16])0x0,auVar121);
                    auVar122 = vpunpcklbw_avx(auVar113,auVar110);
                    auVar113 = vpunpckhbw_avx(auVar113,auVar110);
                    auVar110 = vpunpcklbw_avx(auVar121,auVar136);
                    auVar121 = vpunpckhbw_avx(auVar121,auVar136);
                    auVar137 = vpmullw_avx(auVar122,auVar133);
                    auVar122 = vpmulhw_avx(auVar122,auVar133);
                    auVar135 = vpmullw_avx(auVar133,auVar113);
                    auVar123 = vpmulhw_avx(auVar133,auVar113);
                    auVar128 = vpmullw_avx(auVar110,auVar133);
                    auVar119 = vpmulhw_avx(auVar110,auVar133);
                    auVar115 = vpmullw_avx(auVar133,auVar121);
                    auVar133 = vpmulhw_avx(auVar133,auVar121);
                    auVar113 = vpunpcklwd_avx(auVar137,auVar122);
                    auVar113 = vpaddd_avx(auVar129._0_16_,auVar113);
                    auVar121 = vpunpcklwd_avx(auVar135,auVar123);
                    auVar121 = vpaddd_avx(auVar127._0_16_,auVar121);
                    auVar110 = vpunpcklwd_avx(auVar128,auVar119);
                    auVar110 = vpaddd_avx(auVar125._0_16_,auVar110);
                    auVar136 = vpunpcklwd_avx(auVar115,auVar133);
                    auVar136 = vpaddd_avx(auVar124._0_16_,auVar136);
                    auVar122 = vpunpckhwd_avx(auVar137,auVar122);
                    auVar113 = vpaddd_avx(auVar113,auVar122);
                    auVar129 = ZEXT1664(auVar113);
                    auVar113 = vpunpckhwd_avx(auVar135,auVar123);
                    auVar113 = vpaddd_avx(auVar121,auVar113);
                    auVar127 = ZEXT1664(auVar113);
                    auVar113 = vpunpckhwd_avx(auVar128,auVar119);
                    auVar113 = vpaddd_avx(auVar110,auVar113);
                    auVar125 = ZEXT1664(auVar113);
                    auVar113 = vpunpckhwd_avx(auVar115,auVar133);
                    auVar113 = vpaddd_avx(auVar136,auVar113);
                    auVar124 = ZEXT1664(auVar113);
                  }
                  pvVar65 = (void *)((long)pvVar65 + uVar44 * 0x20);
                }
                auVar113 = vpunpckldq_avx(auVar129._0_16_,auVar127._0_16_);
                auVar136 = vpunpckldq_avx(auVar125._0_16_,auVar124._0_16_);
                auVar121 = vpunpckhdq_avx(auVar129._0_16_,auVar127._0_16_);
                auVar110 = vpunpckhdq_avx(auVar125._0_16_,auVar124._0_16_);
                auVar122 = vpunpcklqdq_avx(auVar113,auVar136);
                auVar113 = vpunpckhqdq_avx(auVar113,auVar136);
                auVar113 = vpaddd_avx(auVar122,auVar113);
                auVar136 = vpunpcklqdq_avx(auVar121,auVar110);
                auVar121 = vpunpckhqdq_avx(auVar121,auVar110);
                auVar121 = vpaddd_avx(auVar121,auVar136);
                auVar113 = vpaddd_avx(auVar113,auVar121);
                *(undefined1 (*) [16])((long)local_6b8 + uVar80 * 0x10) = auVar113;
              }
              local_6b8 = (Mat *)((long)local_6b8 + lVar69 * 0x10);
            }
          }
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&opt_q);
        }
        goto LAB_001f8aad;
      }
      iVar82 = cpu_support_x86_avx2();
      if (iVar82 == 0) {
        iVar88 = cpu_support_x86_xop();
        iVar82 = local_688.c;
        if (iVar88 == 0) {
          local_630[2] = 0;
          local_630[3] = 0;
          local_630[0] = (undefined2)local_688.elempack;
          local_630[1] = local_688.elempack._2_2_;
          auVar113._4_4_ = local_618.h;
          auVar113._0_4_ = local_618.w;
          local_640[0] = (undefined2)local_618.c;
          local_640[1] = local_618.c._2_2_;
          piVar78 = (int *)CONCAT44(local_688.refcount._4_4_,local_688.refcount._0_4_);
          local_568.data = local_688.data;
          local_568.refcount._0_4_ = local_688.refcount._0_4_;
          local_568.refcount._4_4_ = local_688.refcount._4_4_;
          local_568.elemsize = local_688.elemsize;
          local_568.elempack = local_688.elempack;
          local_568.allocator = local_688.allocator;
          local_568.d = local_688.d;
          local_568.h = local_688.h;
          local_568.dims = local_688.dims;
          local_568.w = local_688.w;
          local_568.c = local_688.c;
          local_568.cstep = local_688.cstep;
          if (piVar78 != (int *)0x0) {
            LOCK();
            *piVar78 = *piVar78 + 1;
            UNLOCK();
          }
          auVar136._8_4_ = 3;
          auVar136._0_8_ = 0x300000003;
          auVar136._12_4_ = 3;
          auVar113._8_8_ = 0;
          auVar113 = vpaddd_avx(auVar113,auVar136);
          auVar121 = vpsrad_avx(auVar113,0x1f);
          auVar121 = vpsrld_avx(auVar121,0x1e);
          auVar113 = vpaddd_avx(auVar113,auVar121);
          auVar124 = ZEXT1664(auVar113);
          auVar110._8_4_ = 0xfffffffc;
          auVar110._0_8_ = 0xfffffffcfffffffc;
          auVar110._12_4_ = 0xfffffffc;
          auVar121 = vpand_avx(auVar113,auVar110);
          local_5c0 = (ulong)auVar121._4_4_;
          local_510 = CONCAT44((int)(local_688.cstep >> 0x20),auVar121._0_4_);
          iVar93 = auVar121._0_4_ + 2;
          copy_make_border(&local_688,&local_568,0,(auVar121._4_4_ + 2) - local_688.h,0,
                           iVar93 - local_688.w,0,0.0,opt);
          auVar110 = vpsrad_avx(auVar113,2);
          uVar73 = auVar110._0_4_;
          iVar88 = uVar73 * 6;
          uVar74 = auVar110._4_4_;
          local_5c8 = (void *)CONCAT44(local_5c8._4_4_,iVar88 * uVar74);
          uVar44 = (long)(int)(iVar88 * uVar74) / 6;
          local_628 = (void *)(ulong)(uint)(local_630._0_4_ * 2);
          d0[0] = 0;
          d0[1] = 0;
          d0[2] = 0;
          d0[3] = 0;
          iVar97 = (int)uVar44;
          Mat::create((Mat *)d0,iVar97,0x24,iVar82,(size_t)local_628,local_630._0_4_,
                      opt->workspace_allocator);
          lVar83 = (long)(iVar97 * 8);
          lVar69 = (long)(iVar97 << 4);
          uVar103 = 0;
          uVar64 = 0;
          if (0 < (int)uVar73) {
            uVar64 = (ulong)uVar73;
          }
          uStack_6b0 = auVar113._8_8_;
          local_6b8 = (Mat *)uVar64;
          uVar106 = (ulong)uVar74;
          if ((int)uVar74 < 1) {
            uVar106 = uVar103;
          }
          uVar81 = 0;
          if (0 < iVar82) {
            uVar81 = (ulong)(uint)iVar82;
          }
          auVar122._8_4_ = 0xfffbfffb;
          auVar122._0_8_ = 0xfffbfffbfffbfffb;
          auVar122._12_4_ = 0xfffbfffb;
          for (; auVar113 = auVar124._0_16_, uVar103 != uVar81; uVar103 = uVar103 + 1) {
            pauVar99 = (undefined1 (*) [16])
                       ((long)local_568.data + local_568.cstep * local_568.elemsize * uVar103 + 0x20
                       );
            for (uVar52 = 0; uVar52 != uVar106; uVar52 = uVar52 + 1) {
              pauVar45 = (undefined1 (*) [16])((long)((iVar88 * (int)uVar52) / 6) * 0x10 + (long)d0)
              ;
              pauVar57 = pauVar99;
              for (uVar84 = 0; lVar51 = -0x60, pauVar55 = pauVar57, uVar84 != uVar64;
                  uVar84 = uVar84 + 1) {
                for (; pauVar49 = pauVar45, lVar92 = 0x50, lVar51 != 0; lVar51 = lVar51 + 0x10) {
                  auVar113 = pauVar55[-2];
                  auVar110 = pauVar55[-1];
                  auVar136 = *pauVar55;
                  auVar123 = vpcmpgtb_avx((undefined1  [16])0x0,auVar113);
                  auVar119 = vpcmpgtb_avx((undefined1  [16])0x0,auVar110);
                  auVar133 = vpcmpgtb_avx((undefined1  [16])0x0,auVar136);
                  auVar137 = vpunpcklbw_avx(auVar113,auVar123);
                  auVar135 = vpunpckhbw_avx(auVar113,auVar123);
                  auVar123 = vpunpcklbw_avx(auVar110,auVar119);
                  auVar119 = vpunpckhbw_avx(auVar110,auVar119);
                  auVar115 = vpunpcklbw_avx(auVar136,auVar133);
                  auVar128 = vpunpckhbw_avx(auVar136,auVar133);
                  auVar113 = vpsllw_avx(auVar137,2);
                  auVar113 = vpaddw_avx(auVar113,auVar115);
                  auVar110 = vpmullw_avx(auVar123,auVar122);
                  auVar113 = vpaddw_avx(auVar113,auVar110);
                  auVar110 = vpaddw_avx(auVar115,auVar119);
                  auVar136 = vpaddw_avx(auVar123,auVar135);
                  auVar136 = vpsllw_avx(auVar136,2);
                  auVar133 = vpsubw_avx(auVar110,auVar136);
                  auVar110 = vpsubw_avx(auVar115,auVar119);
                  auVar136 = vpsubw_avx(auVar135,auVar123);
                  auVar136 = vpsllw_avx(auVar136,2);
                  auVar110 = vpaddw_avx(auVar110,auVar136);
                  auVar123 = vpsubw_avx(auVar115,auVar123);
                  auVar136 = vpsubw_avx(auVar135,auVar119);
                  auVar136 = vpaddw_avx(auVar136,auVar136);
                  auVar137 = vpsubw_avx(auVar123,auVar136);
                  auVar136 = vpaddw_avx(auVar123,auVar136);
                  auVar123 = vpsllw_avx(auVar135,2);
                  auVar123 = vpaddw_avx(auVar123,auVar128);
                  auVar119 = vpmullw_avx(auVar119,auVar122);
                  auVar123 = vpaddw_avx(auVar123,auVar119);
                  auVar124 = ZEXT1664(auVar123);
                  *(undefined1 (*) [16])(auStack_368 + lVar51) = auVar113;
                  *(undefined1 (*) [16])(auStack_308 + lVar51) = auVar133;
                  *(undefined1 (*) [16])(auStack_2a8 + lVar51) = auVar110;
                  *(undefined1 (*) [16])(auStack_248 + lVar51) = auVar137;
                  *(undefined1 (*) [16])(auStack_1e8 + lVar51) = auVar136;
                  *(undefined1 (*) [16])((long)&local_188 + lVar51) = auVar123;
                  pauVar55 = (undefined1 (*) [16])(*pauVar55 + iVar93 * 8);
                }
                for (; lVar92 != 0x290; lVar92 = lVar92 + 0x60) {
                  auVar113 = *(undefined1 (*) [16])((long)local_408 + lVar92);
                  auVar110 = *(undefined1 (*) [16])((long)local_3f8 + lVar92);
                  auVar136 = *(undefined1 (*) [16])(auStack_3e8 + lVar92);
                  auVar123 = *(undefined1 (*) [16])((long)w1 + lVar92);
                  auVar119 = vpsllw_avx(*(undefined1 (*) [16])((long)w2 + lVar92),2);
                  auVar133 = vpmullw_avx(auVar110,auVar122);
                  auVar119 = vpaddw_avx(auVar119,auVar123);
                  auVar119 = vpaddw_avx(auVar133,auVar119);
                  auVar124 = ZEXT1664(auVar119);
                  auVar133 = vpaddw_avx(auVar123,auVar136);
                  auVar137 = vpaddw_avx(auVar110,auVar113);
                  auVar137 = vpsllw_avx(auVar137,2);
                  auVar137 = vpsubw_avx(auVar133,auVar137);
                  auVar133 = vpsubw_avx(auVar123,auVar136);
                  auVar135 = vpsubw_avx(auVar113,auVar110);
                  auVar135 = vpsllw_avx(auVar135,2);
                  auVar133 = vpaddw_avx(auVar135,auVar133);
                  auVar123 = vpsubw_avx(auVar123,auVar110);
                  auVar110 = vpsubw_avx(auVar113,auVar136);
                  auVar110 = vpaddw_avx(auVar110,auVar110);
                  auVar135 = vpsubw_avx(auVar123,auVar110);
                  auVar110 = vpaddw_avx(auVar123,auVar110);
                  auVar123 = vpsllw_avx(auVar113,2);
                  auVar113 = vpmullw_avx(auVar136,auVar122);
                  auVar113 = vpaddw_avx(auVar113,auVar123);
                  auVar113 = vpaddw_avx(auVar113,*(undefined1 (*) [16])(&opt_q.lightmode + lVar92));
                  *pauVar49 = auVar119;
                  *(undefined1 (*) [16])(*pauVar49 + lVar83 * 2) = auVar137;
                  *(undefined1 (*) [16])(*pauVar49 + lVar69 * 2) = auVar133;
                  *(undefined1 (*) [16])(*pauVar49 + (long)(iVar97 * 0x18) * 2) = auVar135;
                  *(undefined1 (*) [16])(*pauVar49 + (long)(iVar97 << 5) * 2) = auVar110;
                  *(undefined1 (*) [16])(*pauVar49 + (long)(iVar97 * 0x28) * 2) = auVar113;
                  pauVar49 = (undefined1 (*) [16])(*pauVar49 + (long)(iVar97 * 0x30) * 2);
                }
                pauVar57 = pauVar57 + 2;
                pauVar45 = pauVar45 + 1;
              }
              pauVar99 = (undefined1 (*) [16])
                         (*pauVar99 + (long)local_568.w * local_568.elemsize * 4);
            }
          }
          piVar78 = (int *)CONCAT44(local_568.refcount._4_4_,local_568.refcount._0_4_);
          if (piVar78 != (int *)0x0) {
            LOCK();
            *piVar78 = *piVar78 + -1;
            UNLOCK();
            if (*piVar78 == 0) {
              if (local_568.allocator == (Allocator *)0x0) {
                free(local_568.data);
              }
              else {
                (*(local_568.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_568.cstep = 0;
          local_568.data = (void *)0x0;
          local_568.refcount._0_4_ = 0;
          local_568.refcount._4_4_ = 0;
          local_568.elemsize = 0;
          local_568.elempack = 0;
          local_568.h = 0;
          local_568.d = 0;
          local_568.c = 0;
          local_568.allocator = (Allocator *)0x0;
          local_568.dims = 0;
          local_568.w = 0;
          d1[0] = 0;
          d1[1] = 0;
          d1[2] = 0;
          d1[3] = 0;
          opt_q.workspace_allocator._0_4_ = 0;
          opt_q.workspace_allocator._4_4_ = 0;
          opt_q.openmp_blocktime = 0;
          opt_q.lightmode = false;
          opt_q._1_3_ = 0;
          opt_q.num_threads = 0;
          opt_q.blob_allocator._0_4_ = 0;
          opt_q.blob_allocator._4_4_ = 0;
          opt_q._32_28_ = ZEXT1228((undefined1  [12])opt_q._32_12_);
          iVar93 = 0;
          if (0xb < (int)local_5c8) {
            iVar93 = (int)((uVar44 & 0xffffffff) >> 1);
          }
          opt_q._32_32_ = ZEXT1632((undefined1  [16])opt_q._48_16_) << 0x80;
          Mat::create((Mat *)&opt_q,iVar82 << (0xb < (int)local_5c8),iVar97 - iVar93,0x24,
                      (size_t)local_628,local_630._0_4_,opt->workspace_allocator);
          lVar51 = (long)iVar97;
          for (lVar92 = 0; lVar92 != 0x24; lVar92 = lVar92 + 1) {
            lVar86 = (long)(int)opt_q._44_4_ *
                     CONCAT44(opt_q.workspace_allocator._4_4_,opt_q.workspace_allocator._0_4_);
            for (uVar44 = 0; (long)(uVar44 | 1) < lVar51; uVar44 = uVar44 + 2) {
              puVar76 = (undefined8 *)((uVar44 >> 1) * lVar86 + opt_q._0_8_);
              puVar75 = (undefined8 *)((uVar44 + lVar92 * lVar51) * 0x10 + (long)d0);
              uVar103 = uVar81;
              while (iVar82 = (int)uVar103, uVar103 = (ulong)(iVar82 - 1), iVar82 != 0) {
                uVar41 = puVar75[1];
                uVar42 = puVar75[2];
                uVar43 = puVar75[3];
                *puVar76 = *puVar75;
                puVar76[1] = uVar41;
                puVar76[2] = uVar42;
                puVar76[3] = uVar43;
                puVar76 = puVar76 + 4;
              }
            }
            for (; (long)uVar44 < lVar51; uVar44 = uVar44 + 1) {
              puVar76 = (undefined8 *)
                        ((ulong)(((uint)uVar44 & 1) + ((uint)(uVar44 >> 1) & 0x7fffffff)) * lVar86 +
                        opt_q._0_8_);
              puVar75 = (undefined8 *)((uVar44 + lVar92 * lVar51) * 0x10 + (long)d0);
              uVar103 = uVar81;
              while (iVar82 = (int)uVar103, uVar103 = (ulong)(iVar82 - 1), iVar82 != 0) {
                uVar41 = puVar75[1];
                *puVar76 = *puVar75;
                puVar76[1] = uVar41;
                puVar76 = puVar76 + 2;
              }
            }
          }
          d0[0] = 0;
          d0[1] = 0;
          d0[2] = 0;
          d0[3] = 0;
          auVar124 = ZEXT1664(auVar113);
          Mat::create((Mat *)d1,iVar97,0x24,local_640._0_4_,0x10,4,opt->workspace_allocator);
          uVar103 = 0;
          uVar44 = 0;
          if (0 < (int)local_640._0_4_) {
            uVar44 = (ulong)local_640 & 0xffffffff;
          }
          for (; auVar113 = auVar124._0_16_, uVar103 != uVar44; uVar103 = uVar103 + 1) {
            iVar82 = (this->weight_winograd43_data).w;
            sVar60 = (this->weight_winograd43_data).elemsize;
            pvVar65 = (void *)(sVar60 * (this->weight_winograd43_data).cstep * uVar103 +
                              (long)(this->weight_winograd43_data).data);
            asVar46 = d1;
            for (lVar92 = 0; lVar92 != 0x24; lVar92 = lVar92 + 1) {
              lVar86 = opt_q._0_8_;
              for (uVar52 = 0; (long)(uVar52 | 1) < lVar51; uVar52 = uVar52 + 2) {
                auVar124 = ZEXT1664((undefined1  [16])0x0);
                lVar101 = 0;
                auVar125 = ZEXT1664((undefined1  [16])0x0);
                auVar127 = ZEXT1664((undefined1  [16])0x0);
                auVar129 = ZEXT1664((undefined1  [16])0x0);
                auVar130 = ZEXT1664((undefined1  [16])0x0);
                auVar131 = ZEXT1664((undefined1  [16])0x0);
                auVar132 = ZEXT1664((undefined1  [16])0x0);
                auVar134 = ZEXT1664((undefined1  [16])0x0);
                uVar84 = uVar81;
                while( true ) {
                  iVar93 = (int)uVar84;
                  uVar84 = (ulong)(iVar93 - 1);
                  auVar133 = auVar132._0_16_;
                  auVar137 = auVar134._0_16_;
                  auVar123 = auVar130._0_16_;
                  auVar119 = auVar131._0_16_;
                  auVar136 = auVar127._0_16_;
                  auVar122 = auVar129._0_16_;
                  auVar113 = auVar124._0_16_;
                  auVar110 = auVar125._0_16_;
                  if (iVar93 == 0) break;
                  auVar135 = *(undefined1 (*) [16])(lVar86 + lVar101);
                  auVar128 = *(undefined1 (*) [16])(lVar86 + 0x10 + lVar101);
                  auVar115 = *(undefined1 (*) [16])((long)pvVar65 + lVar101 * 2);
                  auVar116 = *(undefined1 (*) [16])((long)pvVar65 + lVar101 * 2 + 0x10);
                  auVar118 = *(undefined1 (*) [16])((long)pvVar65 + lVar101 * 2 + 0x20);
                  auVar126 = *(undefined1 (*) [16])((long)pvVar65 + lVar101 * 2 + 0x30);
                  auVar111 = vpmaddwd_avx(auVar135,auVar115);
                  auVar137 = vpaddd_avx(auVar111,auVar137);
                  auVar134 = ZEXT1664(auVar137);
                  auVar137 = vpmaddwd_avx(auVar135,auVar116);
                  auVar133 = vpaddd_avx(auVar137,auVar133);
                  auVar132 = ZEXT1664(auVar133);
                  auVar133 = vpmaddwd_avx(auVar135,auVar118);
                  auVar119 = vpaddd_avx(auVar133,auVar119);
                  auVar131 = ZEXT1664(auVar119);
                  auVar119 = vpmaddwd_avx(auVar135,auVar126);
                  auVar123 = vpaddd_avx(auVar119,auVar123);
                  auVar130 = ZEXT1664(auVar123);
                  auVar123 = vpmaddwd_avx(auVar128,auVar115);
                  auVar122 = vpaddd_avx(auVar123,auVar122);
                  auVar129 = ZEXT1664(auVar122);
                  auVar122 = vpmaddwd_avx(auVar128,auVar116);
                  auVar136 = vpaddd_avx(auVar122,auVar136);
                  auVar127 = ZEXT1664(auVar136);
                  auVar136 = vpmaddwd_avx(auVar128,auVar118);
                  auVar110 = vpaddd_avx(auVar136,auVar110);
                  auVar125 = ZEXT1664(auVar110);
                  auVar110 = vpmaddwd_avx(auVar128,auVar126);
                  auVar113 = vpaddd_avx(auVar110,auVar113);
                  auVar124 = ZEXT1664(auVar113);
                  lVar101 = lVar101 + 0x20;
                }
                auVar135 = vpunpckldq_avx(auVar137,auVar133);
                auVar128 = vpunpckldq_avx(auVar119,auVar123);
                auVar133 = vpunpckhdq_avx(auVar137,auVar133);
                auVar123 = vpunpckhdq_avx(auVar119,auVar123);
                auVar119 = vpunpckldq_avx(auVar122,auVar136);
                auVar137 = vpunpckldq_avx(auVar110,auVar113);
                auVar136 = vpunpckhdq_avx(auVar122,auVar136);
                auVar122 = vpunpckhdq_avx(auVar110,auVar113);
                auVar110 = vpunpcklqdq_avx(auVar135,auVar128);
                auVar113 = vpunpckhqdq_avx(auVar135,auVar128);
                auVar113 = vpaddd_avx(auVar110,auVar113);
                auVar135 = vpunpcklqdq_avx(auVar133,auVar123);
                auVar110 = vpunpckhqdq_avx(auVar133,auVar123);
                auVar110 = vpaddd_avx(auVar110,auVar135);
                auVar113 = vpaddd_avx(auVar113,auVar110);
                auVar124 = ZEXT1664(auVar113);
                auVar123 = vpunpcklqdq_avx(auVar119,auVar137);
                auVar110 = vpunpckhqdq_avx(auVar119,auVar137);
                auVar110 = vpaddd_avx(auVar123,auVar110);
                auVar123 = vpunpcklqdq_avx(auVar136,auVar122);
                auVar136 = vpunpckhqdq_avx(auVar136,auVar122);
                auVar136 = vpaddd_avx(auVar136,auVar123);
                auVar110 = vpaddd_avx(auVar110,auVar136);
                *(undefined1 (*) [16])asVar46 = auVar113;
                *(undefined1 (*) [16])((long)asVar46 + 0x10) = auVar110;
                asVar46 = (short  [4])((long)asVar46 + 0x20);
                lVar86 = lVar86 + CONCAT44(opt_q.workspace_allocator._4_4_,
                                           opt_q.workspace_allocator._0_4_) *
                                  (long)(int)opt_q._44_4_;
              }
              while (uVar74 = (uint)uVar52, (int)uVar74 < iVar97) {
                auVar124 = ZEXT1664((undefined1  [16])0x0);
                lVar86 = 0;
                auVar125 = ZEXT1664((undefined1  [16])0x0);
                auVar127 = ZEXT1664((undefined1  [16])0x0);
                auVar129 = ZEXT1664((undefined1  [16])0x0);
                uVar84 = uVar81;
                while( true ) {
                  iVar93 = (int)uVar84;
                  uVar84 = (ulong)(iVar93 - 1);
                  auVar136 = auVar127._0_16_;
                  auVar122 = auVar129._0_16_;
                  auVar113 = auVar124._0_16_;
                  auVar110 = auVar125._0_16_;
                  if (iVar93 == 0) break;
                  auVar123 = *(undefined1 (*) [16])
                              ((ulong)((uVar74 & 1) + ((uint)(uVar52 >> 1) & 0x7fffffff)) *
                               (long)(int)opt_q._44_4_ *
                               CONCAT44(opt_q.workspace_allocator._4_4_,
                                        opt_q.workspace_allocator._0_4_) + opt_q._0_8_ + lVar86);
                  auVar119 = vpmaddwd_avx(auVar123,*(undefined1 (*) [16])
                                                    ((long)pvVar65 + lVar86 * 4));
                  auVar122 = vpaddd_avx(auVar119,auVar122);
                  auVar129 = ZEXT1664(auVar122);
                  auVar122 = vpmaddwd_avx(auVar123,*(undefined1 (*) [16])
                                                    ((long)pvVar65 + lVar86 * 4 + 0x10));
                  auVar136 = vpaddd_avx(auVar122,auVar136);
                  auVar127 = ZEXT1664(auVar136);
                  auVar136 = vpmaddwd_avx(auVar123,*(undefined1 (*) [16])
                                                    ((long)pvVar65 + lVar86 * 4 + 0x20));
                  auVar110 = vpaddd_avx(auVar136,auVar110);
                  auVar125 = ZEXT1664(auVar110);
                  auVar110 = vpmaddwd_avx(auVar123,*(undefined1 (*) [16])
                                                    ((long)pvVar65 + lVar86 * 4 + 0x30));
                  auVar113 = vpaddd_avx(auVar110,auVar113);
                  auVar124 = ZEXT1664(auVar113);
                  lVar86 = lVar86 + 0x10;
                }
                auVar123 = vpunpckldq_avx(auVar122,auVar136);
                auVar119 = vpunpckldq_avx(auVar110,auVar113);
                auVar136 = vpunpckhdq_avx(auVar122,auVar136);
                auVar110 = vpunpckhdq_avx(auVar110,auVar113);
                auVar122 = vpunpcklqdq_avx(auVar123,auVar119);
                auVar113 = vpunpckhqdq_avx(auVar123,auVar119);
                auVar113 = vpaddd_avx(auVar122,auVar113);
                auVar124 = ZEXT1664(auVar113);
                auVar122 = vpunpcklqdq_avx(auVar136,auVar110);
                auVar110 = vpunpckhqdq_avx(auVar136,auVar110);
                auVar110 = vpaddd_avx(auVar110,auVar122);
                auVar113 = vpaddd_avx(auVar113,auVar110);
                *(undefined1 (*) [16])asVar46 = auVar113;
                asVar46 = (short  [4])((long)asVar46 + 0x10);
                uVar52 = (ulong)(uVar74 + 1);
              }
              pvVar65 = (void *)((long)pvVar65 + (long)iVar82 * sVar60);
            }
          }
          piVar78 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
          if (piVar78 != (int *)0x0) {
            LOCK();
            *piVar78 = *piVar78 + -1;
            UNLOCK();
            if (*piVar78 == 0) {
              if (opt_q._32_8_ == 0) {
                free((void *)opt_q._0_8_);
              }
              else {
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                auVar124._8_56_ = extraout_var;
                auVar124._0_8_ = extraout_XMM1_Qa;
                auVar113 = auVar124._0_16_;
              }
            }
          }
          d0[0] = 0;
          d0[1] = 0;
          d0[2] = 0;
          d0[3] = 0;
          local_448 = 0;
          opt_b.lightmode = false;
          opt_b._1_3_ = 0;
          opt_b.num_threads = 0;
          opt_b.blob_allocator._0_4_ = 0;
          opt_b.blob_allocator._4_4_ = 0;
          opt_b.workspace_allocator = (Allocator *)0x0;
          opt_b.openmp_blocktime = 0;
          opt_b.use_bf16_storage = false;
          opt_b.use_fp16_packed = false;
          opt_b.use_fp16_storage = false;
          opt_b.use_fp16_arithmetic = false;
          opt_b.use_int8_packed = false;
          opt_b.use_int8_storage = false;
          opt_b.use_int8_arithmetic = false;
          opt_b.use_packing_layout = false;
          opt_b.use_shader_pack8 = false;
          opt_b.use_subgroup_basic = false;
          opt_b.use_subgroup_vote = false;
          opt_b.use_subgroup_ballot = false;
          opt_b.use_subgroup_shuffle = false;
          opt_b.use_image_storage = false;
          opt_b.use_tensor_storage = false;
          opt_b.use_reserved_0 = false;
          opt_b.flush_denormals = 0;
          opt_b.use_local_pool_allocator = false;
          opt_b.use_shader_local_memory = false;
          opt_b.use_cooperative_matrix = false;
          opt_b.use_winograd23_convolution = false;
          opt_b.use_winograd43_convolution = false;
          opt_b.use_winograd63_convolution = false;
          opt_b.use_a53_a55_optimized_kernel = false;
          opt_b.use_reserved_7 = false;
          auVar123._4_4_ = local_618.h;
          auVar123._0_4_ = local_618.w;
          auVar123._8_8_ = 0;
          auVar121 = vpcmpeqd_avx(auVar123,auVar121);
          auVar121 = vpmovsxdq_avx(auVar121);
          auVar113 = vpcmpeqd_avx(auVar113,auVar113);
          if (((auVar113 & ~auVar121) >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
              -1 < SUB161(auVar113 & ~auVar121,0xf)) {
            piVar78 = (int *)CONCAT44(local_618.refcount._4_4_,local_618.refcount._0_4_);
            if (piVar78 != (int *)0x0) {
              LOCK();
              *piVar78 = *piVar78 + 1;
              UNLOCK();
            }
            opt_b._0_8_ = local_618.data;
            opt_b.blob_allocator._0_4_ = local_618.refcount._0_4_;
            opt_b.blob_allocator._4_4_ = local_618.refcount._4_4_;
            opt_b.workspace_allocator = (Allocator *)local_618.elemsize;
            opt_b.openmp_blocktime = local_618.elempack;
            opt_b._32_8_ = local_618.allocator;
            opt_b.use_shader_pack8 = (bool)(undefined1)local_618.dims;
            opt_b.use_subgroup_basic = (bool)local_618.dims._1_1_;
            opt_b.use_subgroup_vote = (bool)local_618.dims._2_1_;
            opt_b.use_subgroup_ballot = (bool)local_618.dims._3_1_;
            opt_b.use_subgroup_shuffle = (bool)(undefined1)local_618.w;
            opt_b.use_image_storage = (bool)local_618.w._1_1_;
            opt_b.use_tensor_storage = (bool)local_618.w._2_1_;
            opt_b.use_reserved_0 = (bool)local_618.w._3_1_;
            opt_b.flush_denormals = local_618.h;
            opt_b.use_local_pool_allocator = (bool)(undefined1)local_618.d;
            opt_b.use_shader_local_memory = (bool)local_618.d._1_1_;
            opt_b.use_cooperative_matrix = (bool)local_618.d._2_1_;
            opt_b.use_winograd23_convolution = (bool)local_618.d._3_1_;
            opt_b.use_winograd43_convolution = (bool)(undefined1)local_618.c;
            opt_b.use_winograd63_convolution = (bool)local_618.c._1_1_;
            opt_b.use_a53_a55_optimized_kernel = (bool)local_618.c._2_1_;
            opt_b.use_reserved_7 = (bool)local_618.c._3_1_;
            local_448 = local_618.cstep;
          }
          else {
            Mat::create((Mat *)&opt_b,(int)local_510,(int)local_5c0,local_640._0_4_,0x10,4,
                        opt->workspace_allocator);
          }
          for (uVar103 = 0; uVar103 != uVar44; uVar103 = uVar103 + 1) {
            pauVar99 = (undefined1 (*) [16])
                       (opt_b._0_8_ + local_448 * (long)opt_b.workspace_allocator * uVar103 + 0x30);
            for (uVar81 = 0; uVar81 != uVar106; uVar81 = uVar81 + 1) {
              pauVar45 = (undefined1 (*) [16])((long)((iVar88 * (int)uVar81) / 6) * 0x10 + (long)d1)
              ;
              pauVar57 = pauVar99;
              for (uVar52 = 0; lVar51 = -0x50, pauVar55 = pauVar45, uVar52 != uVar64;
                  uVar52 = uVar52 + 1) {
                for (; lVar51 != 0; lVar51 = lVar51 + 0x10) {
                  auVar113 = vpaddd_avx(*(undefined1 (*) [16])(*pauVar55 + lVar83 * 4),
                                        *(undefined1 (*) [16])(*pauVar55 + (long)(iVar97 * 4) * 4));
                  auVar122 = vpsubd_avx(*(undefined1 (*) [16])(*pauVar55 + (long)(iVar97 * 4) * 4),
                                        *(undefined1 (*) [16])(*pauVar55 + lVar83 * 4));
                  auVar121 = vpaddd_avx(*(undefined1 (*) [16])(*pauVar55 + lVar69 * 4),
                                        *(undefined1 (*) [16])(*pauVar55 + (long)(iVar97 * 0xc) * 4)
                                       );
                  auVar110 = vpaddd_avx(auVar113,*pauVar55);
                  auVar123 = vpsubd_avx(*(undefined1 (*) [16])(*pauVar55 + (long)(iVar97 * 0xc) * 4)
                                        ,*(undefined1 (*) [16])(*pauVar55 + lVar69 * 4));
                  auVar110 = vpaddd_avx(auVar110,auVar121);
                  auVar136 = vpaddd_avx(auVar123,auVar123);
                  auVar136 = vpaddd_avx(auVar136,auVar122);
                  auVar121 = vpslld_avx(auVar121,2);
                  auVar113 = vpaddd_avx(auVar121,auVar113);
                  auVar121 = vpslld_avx(*(undefined1 (*) [16])
                                         (*pauVar55 + (long)(iVar97 * 0x14) * 4),2);
                  auVar121 = vpaddd_avx(auVar121,auVar122);
                  auVar122 = vpslld_avx(auVar123,3);
                  auVar121 = vpaddd_avx(auVar121,auVar122);
                  *(undefined1 (*) [16])(local_378 + lVar51) = auVar110;
                  *(undefined1 (*) [16])(local_318 + lVar51) = auVar136;
                  *(undefined1 (*) [16])(local_2b8 + lVar51) = auVar113;
                  *(undefined1 (*) [16])(local_258 + lVar51) = auVar121;
                  pauVar55 = (undefined1 (*) [16])(*pauVar55 + (long)(iVar97 * 0x18) * 4);
                }
                auVar121 = vpslld_avx(*(undefined1 (*) [16])(*pauVar55 + (long)(iVar97 * 0x14) * 4),
                                      4);
                auVar113 = vpsubd_avx(*(undefined1 (*) [16])(*pauVar55 + (long)(iVar97 * 4) * 4),
                                      *(undefined1 (*) [16])(*pauVar55 + lVar83 * 4));
                auVar122 = vpslld_avx(auVar113,2);
                auVar113 = vpaddd_avx(auVar122,auVar121);
                auVar110 = vpsubd_avx(*(undefined1 (*) [16])(*pauVar55 + (long)(iVar97 * 0xc) * 4),
                                      *(undefined1 (*) [16])(*pauVar55 + lVar69 * 4));
                auVar121 = vpslld_avx(auVar110,5);
                local_258 = vpaddd_avx(auVar121,auVar113);
                auVar113 = vpaddd_avx(*(undefined1 (*) [16])(*pauVar55 + lVar69 * 4),
                                      *(undefined1 (*) [16])(*pauVar55 + (long)(iVar97 * 0xc) * 4));
                auVar123 = vpslld_avx(auVar113,4);
                auVar121 = vpaddd_avx(*(undefined1 (*) [16])(*pauVar55 + lVar83 * 4),
                                      *(undefined1 (*) [16])(*pauVar55 + (long)(iVar97 * 4) * 4));
                auVar136 = vpslld_avx(auVar121,2);
                local_2b8 = vpaddd_avx(auVar123,auVar136);
                auVar110 = vpslld_avx(auVar110,3);
                local_318 = vpaddd_avx(auVar110,auVar122);
                auVar121 = vpaddd_avx(auVar121,*pauVar55);
                auVar113 = vpaddd_avx(auVar121,auVar113);
                local_378 = vpslld_avx(auVar113,2);
                pauVar55 = pauVar57;
                for (lVar51 = 0x50; lVar51 != 0x1d0; lVar51 = lVar51 + 0x60) {
                  auVar113 = vpaddd_avx(*(undefined1 (*) [16])((long)local_3f8 + lVar51),
                                        *(undefined1 (*) [16])((long)local_408 + lVar51));
                  auVar122 = vpsubd_avx(*(undefined1 (*) [16])((long)local_408 + lVar51),
                                        *(undefined1 (*) [16])((long)local_3f8 + lVar51));
                  auVar121 = vpaddd_avx(*(undefined1 (*) [16])((long)w1 + lVar51),
                                        *(undefined1 (*) [16])(auStack_3e8 + lVar51));
                  auVar110 = vpaddd_avx(auVar113,*(undefined1 (*) [16])((long)w2 + lVar51));
                  auVar123 = vpsubd_avx(*(undefined1 (*) [16])(auStack_3e8 + lVar51),
                                        *(undefined1 (*) [16])((long)w1 + lVar51));
                  auVar110 = vpaddd_avx(auVar110,auVar121);
                  auVar136 = vpaddd_avx(auVar123,auVar123);
                  auVar136 = vpaddd_avx(auVar136,auVar122);
                  auVar121 = vpslld_avx(auVar121,2);
                  auVar121 = vpaddd_avx(auVar121,auVar113);
                  auVar113 = vpaddd_avx(auVar122,*(undefined1 (*) [16])(&opt_q.lightmode + lVar51));
                  auVar122 = vpslld_avx(auVar123,3);
                  auVar122 = vpaddd_avx(auVar113,auVar122);
                  auVar113 = vcvtdq2ps_avx(auVar110);
                  auVar137._0_4_ = (int)(auVar113._0_4_ * 0.0017361111);
                  auVar137._4_4_ = (int)(auVar113._4_4_ * 0.0017361111);
                  auVar137._8_4_ = (int)(auVar113._8_4_ * 0.0017361111);
                  auVar137._12_4_ = (int)(auVar113._12_4_ * 0.0017361111);
                  auVar113 = vcvtdq2ps_avx(auVar136);
                  auVar135._0_4_ = (int)(auVar113._0_4_ * 0.0017361111);
                  auVar135._4_4_ = (int)(auVar113._4_4_ * 0.0017361111);
                  auVar135._8_4_ = (int)(auVar113._8_4_ * 0.0017361111);
                  auVar135._12_4_ = (int)(auVar113._12_4_ * 0.0017361111);
                  auVar113 = vcvtdq2ps_avx(auVar121);
                  auVar133._0_4_ = (int)(auVar113._0_4_ * 0.0017361111);
                  auVar133._4_4_ = (int)(auVar113._4_4_ * 0.0017361111);
                  auVar133._8_4_ = (int)(auVar113._8_4_ * 0.0017361111);
                  auVar133._12_4_ = (int)(auVar113._12_4_ * 0.0017361111);
                  auVar113 = vcvtdq2ps_avx(auVar122);
                  auVar119._0_4_ = (int)(auVar113._0_4_ * 0.0017361111);
                  auVar119._4_4_ = (int)(auVar113._4_4_ * 0.0017361111);
                  auVar119._8_4_ = (int)(auVar113._8_4_ * 0.0017361111);
                  auVar119._12_4_ = (int)(auVar113._12_4_ * 0.0017361111);
                  pauVar55[-3] = auVar137;
                  pauVar55[-2] = auVar135;
                  pauVar55[-1] = auVar133;
                  *pauVar55 = auVar119;
                  pauVar55 = (undefined1 (*) [16])(*pauVar55 + (long)(int)(uVar73 << 4) * 4);
                }
                pauVar45 = pauVar45 + 1;
                pauVar57 = pauVar57 + 4;
              }
              pauVar99 = (undefined1 (*) [16])
                         (*pauVar99 + (long)(int)opt_b._44_4_ * (long)opt_b.workspace_allocator * 4)
              ;
            }
          }
          copy_cut_border((Mat *)&opt_b,&local_618,0,opt_b.flush_denormals - local_618.h,0,
                          opt_b._44_4_ - local_618.w,opt);
          piVar78 = (int *)CONCAT44(opt_b.blob_allocator._4_4_,opt_b.blob_allocator._0_4_);
          if (piVar78 != (int *)0x0) {
            LOCK();
            *piVar78 = *piVar78 + -1;
            UNLOCK();
            if (*piVar78 == 0) {
              if (opt_b._32_8_ == 0) {
                free((void *)opt_b._0_8_);
              }
              else {
                (**(code **)(*(long *)opt_b._32_8_ + 0x18))();
              }
            }
          }
          piVar78 = (int *)CONCAT44(local_568.refcount._4_4_,local_568.refcount._0_4_);
          if (piVar78 != (int *)0x0) {
            LOCK();
            *piVar78 = *piVar78 + -1;
            UNLOCK();
            if (*piVar78 == 0) {
              if (local_568.allocator == (Allocator *)0x0) {
                free(local_568.data);
              }
              else {
                (*(local_568.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          goto LAB_001f8aad;
        }
        conv3x3s1_winograd43_pack8to4_int8_sse_xop
                  (&local_688,&local_618,&this->weight_winograd43_data,opt);
      }
      else {
        conv3x3s1_winograd43_pack8to4_int8_sse_avx2
                  (&local_688,&local_618,&this->weight_winograd43_data,opt);
      }
    }
LAB_001facda:
    p_Var3 = this->_vptr_Convolution_x86_fma[-3];
    if (local_3dc < 0x65) {
      dequantize_from_int32
                (&local_618,local_3f0,&this->scale_in_data,
                 (Mat *)(p_Var3 + 0x18 + (long)&(this->scale_in_data).data),opt);
      pLVar4 = this->activation;
      iVar82 = 0;
      if (pLVar4 != (Layer *)0x0) {
        (*pLVar4->_vptr_Layer[9])(pLVar4,local_3f0,opt);
      }
    }
    else {
      iVar82 = 0;
      requantize_from_int32_to_int8
                (&local_618,local_3f0,&this->scale_in_data,
                 (Mat *)(&this->field_0x280 + (long)p_Var3),
                 (Mat *)(p_Var3 + 0x18 + (long)&(this->scale_in_data).data),
                 *(int *)(p_Var3 + 0x1c + (long)&(this->weight_winograd43_data).data),
                 (Mat *)(p_Var3 + 0x20 + (long)&(this->weight_winograd43_data).data),opt);
    }
  }
  piVar78 = (int *)CONCAT44(local_618.refcount._4_4_,local_618.refcount._0_4_);
  if (piVar78 != (int *)0x0) {
    LOCK();
    *piVar78 = *piVar78 + -1;
    UNLOCK();
    if (*piVar78 == 0) {
      if (local_618.allocator == (Allocator *)0x0) {
        free(local_618.data);
      }
      else {
        (*(local_618.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_001fadbb:
  piVar78 = (int *)CONCAT44(local_688.refcount._4_4_,local_688.refcount._0_4_);
  if (piVar78 != (int *)0x0) {
    LOCK();
    *piVar78 = *piVar78 + -1;
    UNLOCK();
    if (*piVar78 == 0) {
      if (local_688.allocator == (Allocator *)0x0) {
        free(local_688.data);
      }
      else {
        (*(local_688.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_148.refcount != (int *)0x0) {
    LOCK();
    *local_148.refcount = *local_148.refcount + -1;
    UNLOCK();
    if (*local_148.refcount == 0) {
      if (local_148.allocator == (Allocator *)0x0) {
        free(local_148.data);
      }
      else {
        (*(local_148.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar82;
}

Assistant:

int Convolution_x86_fma::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
    }

    //     NCNN_LOGE("Convolution_arm input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    int w = bottom_blob_bordered.w;
    int h = bottom_blob_bordered.h;
    int channels = bottom_blob_bordered.c;
    int elempack = bottom_blob_bordered.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    //     NCNN_LOGE("forward_int8_arm %d %d %d    %d %d", w, h, bottom_blob_bordered.c, elempack, out_elempack);

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int num_input = channels * elempack;

    int out_elempack_int32 = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    Mat top_blob_int32;
    top_blob_int32.create(outw, outh, num_output / out_elempack_int32, (size_t)(4u * out_elempack_int32), out_elempack_int32, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

#if __SSE2__
    if (elempack == 8 && out_elempack_int32 == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (elempack == 1 && out_elempack_int32 == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 7 && kernel_h == 7 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv7x7s2_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (elempack == 8 && out_elempack_int32 == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack_int32 == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd23_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd23_data, opt);
            // conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_int8(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (use_int8_requantize)
    {
        requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
    }
    else
    {
        dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
    }

    return 0;
}